

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  stbi__uint32 c;
  long lVar6;
  double dVar7;
  short sVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  undefined3 uVar19;
  int iVar20;
  stbi__uint32 sVar21;
  stbi__uint32 sVar22;
  stbi__uint32 sVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  stbi__uint32 sVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  size_t __size;
  stbi__jpeg *psVar34;
  void *pvVar35;
  char *pcVar36;
  stbi__jpeg *psVar37;
  stbi_uc *psVar38;
  stbi_uc *psVar39;
  long lVar40;
  float *output;
  code *pcVar41;
  void *pvVar42;
  undefined8 uVar43;
  uchar *puVar44;
  undefined1 uVar45;
  int req_comp_00;
  int req_comp_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  int iVar46;
  short *psVar47;
  size_t sVar48;
  ulong uVar49;
  undefined1 *puVar50;
  stbi__context *psVar51;
  long lVar52;
  uint uVar53;
  stbi__zhuffman *psVar54;
  uint uVar55;
  uint uVar56;
  char *pcVar57;
  undefined4 in_register_00000084;
  int *piVar58;
  anon_struct_96_18_0d0905d3 *paVar59;
  int *piVar60;
  undefined4 *puVar61;
  ulong uVar62;
  short sVar63;
  int id;
  int iVar64;
  uint uVar65;
  uint uVar66;
  stbi_uc *psVar67;
  void *pvVar68;
  ulong uVar69;
  float *pfVar70;
  int left;
  undefined4 uVar71;
  uint uVar72;
  stbi__uint16 *psVar73;
  long in_FS_OFFSET;
  bool bVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  stbi__context *local_9768;
  ulong local_9760;
  char *local_9758;
  uint local_9750;
  ulong local_9738;
  float *local_9720;
  stbi_uc tc [3];
  stbi__png local_96f8;
  uint local_96cc;
  undefined8 local_96c8;
  ulong local_96c0;
  anon_struct_96_18_0d0905d3 *local_96b8;
  stbi__uint16 *local_96b0;
  undefined8 local_96a8;
  stbi__uint16 *local_96a0;
  ulong local_9698;
  stbi__uint16 local_968e [3];
  undefined8 local_9688;
  undefined7 uStack_9680;
  undefined4 uStack_9679;
  stbi__zhuffman z_codelength;
  byte bStack_8e79;
  stbi_uc lencodes [455];
  stbi_uc palette [1024];
  stbi__pic_packet packets [10];
  undefined8 local_8888;
  undefined8 local_8880;
  undefined8 local_8878;
  stbi_uc local_8870 [4];
  stbi__zhuffman local_886c;
  stbi__zhuffman local_8088 [16];
  stbi__uint16 *local_70;
  uint local_68;
  int local_64;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  
  piVar58 = (int *)CONCAT44(in_register_00000084,req_comp);
  piVar58[0] = 8;
  piVar58[1] = 0;
  piVar58[2] = 0;
  piVar60 = piVar58;
  iVar20 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar20 != 0) {
    tc[2] = '\0';
    tc[0] = '\0';
    tc[1] = '\0';
    local_96f8.idata = (stbi_uc *)0x0;
    local_96f8.expanded = (stbi_uc *)0x0;
    local_96f8.out = (stbi_uc *)0x0;
    local_96f8.s = s;
    iVar20 = stbi__check_png_header(s);
    psVar37 = (stbi__jpeg *)local_96f8.idata;
    if (iVar20 != 0) {
      bVar74 = true;
      psVar37 = (stbi__jpeg *)0x0;
      bVar11 = 0;
      uVar72 = 0;
      bVar9 = false;
      local_9760 = 0;
      uVar26 = 0;
      uVar25 = 0;
      bVar10 = false;
      bVar18 = 0;
LAB_0010b7f4:
      sVar21 = stbi__get32be(s);
      sVar48 = (size_t)sVar21;
      sVar22 = stbi__get32be(s);
      if (sVar22 == 0x43674249) {
        bVar9 = true;
LAB_0010b94f:
        stbi__skip(s,sVar21);
LAB_0010bc05:
        stbi__get32be(s);
        goto LAB_0010b7f4;
      }
      uVar27 = (uint)local_9760;
      if (sVar22 == 0x49444154) {
        if (bVar74) goto LAB_0010c12f;
        if ((bVar18 != 0) && (uVar27 == 0)) {
          pcVar36 = "no PLTE";
          local_96f8.idata = (stbi_uc *)psVar37;
          goto LAB_0010e119;
        }
        if (0x40000000 < sVar21) {
          pcVar36 = "IDAT size limit";
          local_96f8.idata = (stbi_uc *)psVar37;
          goto LAB_0010e119;
        }
        uVar27 = sVar21 + uVar25;
        if ((int)uVar27 < (int)uVar25) goto LAB_0010e122;
        psVar34 = psVar37;
        if (uVar26 < uVar27) {
          if (sVar21 < 0x1001) {
            sVar48 = 0x1000;
          }
          if (uVar26 != 0) {
            sVar48 = (ulong)uVar26;
          }
          do {
            __size = sVar48;
            uVar26 = (uint)__size;
            sVar48 = (ulong)(uVar26 * 2);
          } while (uVar26 < uVar27);
          psVar34 = (stbi__jpeg *)realloc(psVar37,__size);
          if (psVar34 == (stbi__jpeg *)0x0) goto LAB_0010dee3;
        }
        psVar37 = psVar34;
        iVar20 = stbi__getn(s,psVar37->huff_dc[0].fast + ((ulong)uVar25 - 8),sVar21);
        if (iVar20 == 0) {
          pcVar36 = "outofdata";
          local_96f8.idata = (stbi_uc *)psVar37;
          goto LAB_0010e119;
        }
LAB_0010ba9c:
        bVar74 = false;
        uVar25 = uVar27;
        goto LAB_0010bc05;
      }
      if (sVar22 != 0x49484452) {
        if (sVar22 == 0x504c5445) {
          if (!bVar74) {
            if ((sVar21 < 0x301) &&
               (uVar27 = (sVar21 & 0xffff) / 3, local_9760 = (ulong)(ushort)uVar27,
               uVar27 * 3 == sVar21)) {
              for (uVar49 = 0; uVar27 = uVar25, local_9760 != uVar49; uVar49 = uVar49 + 1) {
                sVar13 = stbi__get8(s);
                palette[uVar49 * 4] = sVar13;
                sVar13 = stbi__get8(s);
                palette[uVar49 * 4 + 1] = sVar13;
                sVar13 = stbi__get8(s);
                palette[uVar49 * 4 + 2] = sVar13;
                palette[uVar49 * 4 + 3] = 0xff;
              }
              goto LAB_0010ba9c;
            }
            pcVar36 = "invalid PLTE";
            local_96f8.idata = (stbi_uc *)psVar37;
            goto LAB_0010e119;
          }
        }
        else if (sVar22 == 0x74524e53) {
          if (!bVar74) {
            if (psVar37 != (stbi__jpeg *)0x0) {
              pcVar36 = "tRNS after IDAT";
              local_96f8.idata = (stbi_uc *)psVar37;
              goto LAB_0010e119;
            }
            if (bVar18 == 0) {
              uVar27 = s->img_n;
              if ((uVar27 & 1) == 0) {
                local_96f8.idata = (stbi_uc *)0x0;
                pcVar36 = "tRNS with alpha";
                goto LAB_0010e119;
              }
              if (uVar27 * 2 == sVar21) {
                if (local_9750 == 0x10) {
                  for (uVar49 = 0; (uVar49 < 3 && ((long)uVar49 < (long)(int)uVar27));
                      uVar49 = uVar49 + 1) {
                    iVar20 = stbi__get16be(s);
                    local_968e[uVar49] = (stbi__uint16)iVar20;
                    uVar27 = s->img_n;
                  }
                  local_9750 = 0x10;
                }
                else {
                  for (uVar49 = 0; (uVar49 < 3 && ((long)uVar49 < (long)(int)uVar27));
                      uVar49 = uVar49 + 1) {
                    iVar20 = stbi__get16be(s);
                    tc[uVar49] = ""[(int)local_9750] * (char)iVar20;
                    uVar27 = s->img_n;
                  }
                }
                bVar10 = true;
                psVar37 = (stbi__jpeg *)0x0;
LAB_0010bc02:
                bVar74 = false;
                bVar18 = 0;
                goto LAB_0010bc05;
              }
            }
            else {
              if (uVar27 == 0) {
                local_96f8.idata = (stbi_uc *)0x0;
                pcVar36 = "tRNS before PLTE";
                goto LAB_0010e119;
              }
              if (sVar21 <= uVar27) {
                for (uVar49 = 0; sVar48 != uVar49; uVar49 = uVar49 + 1) {
                  sVar13 = stbi__get8(s);
                  palette[uVar49 * 4 + 3] = sVar13;
                }
                bVar18 = 4;
                psVar37 = (stbi__jpeg *)0x0;
                bVar74 = false;
                goto LAB_0010bc05;
              }
            }
            local_96f8.idata = (stbi_uc *)0x0;
            pcVar36 = "bad tRNS len";
            goto LAB_0010e119;
          }
        }
        else if (sVar22 == 0x49454e44) {
          local_96f8.depth = local_9750;
          if (!bVar74) {
            if (psVar37 == (stbi__jpeg *)0x0) {
              pcVar36 = "no IDAT";
              local_96f8.idata = (stbi_uc *)psVar37;
              goto LAB_0010e119;
            }
            sVar48 = (size_t)(int)(s->img_n * s->img_y * (local_9750 * s->img_x + 7 >> 3) + s->img_y
                                  );
            local_96f8.idata = (stbi_uc *)psVar37;
            psVar39 = (stbi_uc *)malloc(sVar48);
            if (psVar39 == (stbi_uc *)0x0) goto LAB_0010fa58;
            packets._8_8_ = psVar37->huff_dc[0].fast + (long)(int)uVar25 + -8;
            local_8878 = psVar39 + sVar48;
            local_8870[0] = '\x01';
            local_8870[1] = '\0';
            local_8870[2] = '\0';
            local_8870[3] = '\0';
            packets._0_8_ = psVar37;
            local_8888 = psVar39;
            local_8880 = psVar39;
            if (bVar9) {
LAB_0010d43b:
              packets[5].type = '\0';
              packets[5].channel = '\0';
              packets[6].size = '\0';
              packets[6].type = '\0';
              packets[6].channel = '\0';
              packets[7].size = '\0';
              packets[7].type = '\0';
              packets[7].channel = '\0';
              stack0xffffffffffff7770 =
                   (stbi_uc *)((ulong)stack0xffffffffffff7770 & 0xffffffff00000000);
              local_9758 = "zlib corrupt";
              goto LAB_0010d46b;
            }
            uVar26 = 0;
            if ((int)uVar25 < 1) {
              uVar25 = 0;
            }
            else {
              uVar25 = (uint)*(byte *)&psVar37->s;
              psVar37 = (stbi__jpeg *)((long)&psVar37->s + 1);
            }
            packets._0_8_ = psVar37;
            if (psVar37 < (ulong)packets._8_8_) {
              packets._0_8_ = (long)&psVar37->s + 1;
              uVar26 = (uint)*(byte *)&psVar37->s;
            }
            pcVar36 = "bad zlib header";
            if (((ulong)packets._0_8_ < (ulong)packets._8_8_) &&
               ((short)((uVar25 << 8 | uVar26) % 0x1f) == 0)) {
              if ((uVar26 & 0x20) == 0) {
                if ((uVar25 & 0xf) == 8) goto LAB_0010d43b;
                pcVar36 = "bad compression";
              }
              else {
                pcVar36 = "no preset dict";
              }
            }
            *(char **)(in_FS_OFFSET + -8) = pcVar36;
            goto LAB_0010fa4b;
          }
        }
        else if (!bVar74) {
          bVar74 = false;
          if ((sVar22 >> 0x1d & 1) != 0) goto LAB_0010b94f;
          stbi__parse_png_file_invalid_chunk[0] = (char)(sVar22 >> 0x18);
          stbi__parse_png_file_invalid_chunk[1] = (char)(sVar22 >> 0x10);
          stbi__parse_png_file_invalid_chunk[2] = (char)(sVar22 >> 8);
          stbi__parse_png_file_invalid_chunk[3] = (char)sVar22;
          *(char **)(in_FS_OFFSET + -8) = stbi__parse_png_file_invalid_chunk;
          goto LAB_0010e122;
        }
LAB_0010c12f:
        pcVar36 = "first not IHDR";
        local_96f8.idata = (stbi_uc *)psVar37;
        goto LAB_0010e119;
      }
      if (!bVar74) {
        pcVar36 = "multiple IHDR";
        local_96f8.idata = (stbi_uc *)psVar37;
        goto LAB_0010e119;
      }
      if (sVar21 != 0xd) {
        pcVar36 = "bad IHDR len";
        local_96f8.idata = (stbi_uc *)psVar37;
        goto LAB_0010e119;
      }
      sVar21 = stbi__get32be(s);
      s->img_x = sVar21;
      sVar21 = stbi__get32be(s);
      s->img_y = sVar21;
      if ((sVar21 < 0x1000001) && (s->img_x < 0x1000001)) {
        bVar11 = stbi__get8(s);
        if ((0x10 < bVar11) ||
           (local_9750 = (uint)bVar11, (0x10116U >> (local_9750 & 0x1f) & 1) == 0)) {
          pcVar36 = "1/2/4/8/16-bit only";
          local_96f8.idata = (stbi_uc *)psVar37;
          goto LAB_0010e119;
        }
        bVar12 = stbi__get8(s);
        if (bVar12 < 7) {
          uVar72 = (uint)bVar12;
          if (bVar12 == 3) {
            bVar18 = 3;
            if (local_9750 != 0x10) {
LAB_0010baae:
              sVar13 = stbi__get8(s);
              if (sVar13 != '\0') {
                pcVar36 = "bad comp method";
                local_96f8.idata = (stbi_uc *)psVar37;
                goto LAB_0010e119;
              }
              sVar13 = stbi__get8(s);
              if (sVar13 != '\0') {
                pcVar36 = "bad filter method";
                local_96f8.idata = (stbi_uc *)psVar37;
                goto LAB_0010e119;
              }
              bVar11 = stbi__get8(s);
              if (1 < bVar11) {
                pcVar36 = "bad interlace method";
                local_96f8.idata = (stbi_uc *)psVar37;
                goto LAB_0010e119;
              }
              uVar27 = s->img_x;
              if ((uVar27 == 0) || (uVar28 = s->img_y, uVar28 == 0)) {
                pcVar36 = "0-pixel image";
                local_96f8.idata = (stbi_uc *)psVar37;
                goto LAB_0010e119;
              }
              if (bVar18 == 0) {
                uVar29 = (uint)(3 < bVar12) + (bVar12 & 2) + 1;
                s->img_n = uVar29;
                if (uVar28 <= (uint)((0x40000000 / (ulong)uVar27) / (ulong)uVar29))
                goto LAB_0010bc02;
              }
              else {
                s->img_n = 1;
                bVar74 = false;
                if (uVar28 <= (uint)(0x40000000 / (ulong)uVar27 >> 2)) goto LAB_0010bc05;
              }
              goto LAB_0010c26a;
            }
          }
          else if ((bVar12 & 1) == 0) goto LAB_0010baae;
        }
        pcVar36 = "bad ctype";
        local_96f8.idata = (stbi_uc *)psVar37;
        goto LAB_0010e119;
      }
LAB_0010c26a:
      pcVar36 = "too large";
      local_96f8.idata = (stbi_uc *)psVar37;
LAB_0010e119:
      *(char **)(in_FS_OFFSET + -8) = pcVar36;
      psVar37 = (stbi__jpeg *)local_96f8.idata;
    }
    goto LAB_0010e122;
  }
  sVar13 = stbi__get8(s);
  if ((sVar13 == 'B') && (sVar13 = stbi__get8(s), sVar13 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar21 = stbi__get32le(s);
    if (((0x38 < sVar21) || ((0x100010000001000U >> ((ulong)sVar21 & 0x3f) & 1) == 0)) &&
       ((sVar21 != 0x7c && (sVar21 != 0x6c)))) goto LAB_0010bdd6;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    sVar13 = stbi__get8(s);
    if ((sVar13 != 'B') || (sVar13 = stbi__get8(s), sVar13 != 'M')) {
      pcVar36 = "not BMP";
      goto LAB_00110a8c;
    }
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    sVar21 = stbi__get32le(s);
    sVar22 = stbi__get32le(s);
    if ((int)sVar21 < 0) {
LAB_0010e510:
      pcVar36 = "bad BMP";
      goto LAB_00110a8c;
    }
    if (sVar22 == 0xc) {
      sVar23 = stbi__get16le(s);
      s->img_x = sVar23;
      sVar23 = stbi__get16le(s);
    }
    else {
      if ((((sVar22 != 0x28) && (sVar22 != 0x38)) && (sVar22 != 0x6c)) && (sVar22 != 0x7c)) {
        pcVar36 = "unknown BMP";
        goto LAB_00110a8c;
      }
      sVar23 = stbi__get32le(s);
      s->img_x = sVar23;
      sVar23 = stbi__get32le(s);
    }
    s->img_y = sVar23;
    iVar20 = stbi__get16le(s);
    if (iVar20 != 1) goto LAB_0010e510;
    uVar25 = stbi__get16le(s);
    sVar23 = 0;
    uVar71 = 0xff;
    iVar20 = -0xe;
    if (sVar22 == 0xc) {
      uVar26 = 0;
      uVar27 = 0;
      uVar28 = 0;
    }
    else {
      sVar30 = stbi__get32le(s);
      if (sVar30 - 1 < 2) {
        pcVar36 = "BMP RLE";
        goto LAB_00110a8c;
      }
      if (3 < (int)sVar30) {
        pcVar36 = "BMP JPEG/PNG";
        goto LAB_00110a8c;
      }
      sVar63 = (short)uVar25;
      if (((sVar30 == 3) && (sVar63 != 0x10)) && ((uVar25 & 0xffff) != 0x20)) goto LAB_0010e510;
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      if (sVar22 == 0x28) {
LAB_0010e4af:
        uVar72 = uVar25 & 0xffff;
        if ((sVar63 == 0x20) || (uVar72 == 0x10)) {
          if (sVar30 != 0) {
            if (sVar30 == 3) {
              uVar26 = stbi__get32le(s);
              uVar27 = stbi__get32le(s);
              uVar28 = stbi__get32le(s);
              if (uVar27 != uVar28 || uVar26 != uVar27) {
                iVar20 = -0x1a;
                uVar71 = 0xff;
                sVar23 = 0;
                goto LAB_0010bd7d;
              }
            }
            goto LAB_0010e510;
          }
          if (sVar63 == 0x10) {
            uVar28 = 0x1f;
            uVar27 = 0x3e0;
            uVar26 = 0x7c00;
            uVar25 = uVar72;
          }
          else {
            if (uVar72 == 0x20) {
              uVar25 = 0x20;
              sVar23 = 0xff000000;
              uVar71 = 0;
              uVar28 = 0xff;
              uVar27 = 0xff00;
              uVar26 = 0xff0000;
              goto LAB_0010fabd;
            }
            uVar26 = 0;
            uVar27 = 0;
            uVar28 = 0;
          }
        }
        else {
          uVar26 = 0;
          uVar27 = 0;
          uVar28 = 0;
        }
        uVar71 = 0xff;
        sVar23 = 0;
      }
      else {
        if ((sVar22 != 0x7c) && (sVar22 != 0x6c)) {
          if (sVar22 != 0x38) goto LAB_0010e510;
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          goto LAB_0010e4af;
        }
        uVar26 = stbi__get32le(s);
        uVar27 = stbi__get32le(s);
        uVar28 = stbi__get32le(s);
        sVar23 = stbi__get32le(s);
        uVar71 = 0xff;
        if (sVar30 == 0) {
          if (sVar63 == 0x10) {
            uVar28 = 0x1f;
            uVar27 = 0x3e0;
            uVar26 = 0x7c00;
          }
          else if ((uVar25 & 0xffff) == 0x20) {
            sVar23 = 0xff000000;
            uVar71 = 0;
            uVar28 = 0xff;
            uVar27 = 0xff00;
            uVar26 = 0xff0000;
          }
          else {
            uVar26 = 0;
            uVar27 = 0;
            uVar28 = 0;
            sVar23 = 0;
          }
        }
        stbi__get32le(s);
        iVar20 = 0xc;
        while( true ) {
          bVar74 = iVar20 == 0;
          iVar20 = iVar20 + -1;
          if (bVar74) break;
          stbi__get32le(s);
        }
        if (sVar22 != 0x6c) {
          if (sVar22 != 0x7c) {
            return (void *)0x0;
          }
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
        }
      }
LAB_0010fabd:
      iVar20 = -0xe;
    }
LAB_0010bd7d:
    uVar72 = s->img_y;
    uVar29 = -uVar72;
    if (0 < (int)uVar72) {
      uVar29 = uVar72;
    }
    s->img_y = uVar29;
    if ((uVar29 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (sVar22 == 0xc) {
        if (0x17 < uVar25) goto LAB_0010e8a4;
        uVar49 = (long)(int)(iVar20 + sVar21 + -0x18) / 3 & 0xffffffff;
LAB_0010e7e6:
        if ((int)uVar49 == 0) goto LAB_0010e8a4;
        bVar9 = false;
LAB_0010e7fa:
        bVar74 = sVar23 == 0xff000000;
        local_96b0 = (stbi__uint16 *)CONCAT44(local_96b0._4_4_,uVar72);
        iVar46 = 4 - (uint)(sVar23 == 0);
      }
      else {
        if (uVar25 < 0x10) {
          uVar49 = (ulong)(uint)((int)((sVar21 - sVar22) + iVar20) >> 2);
          goto LAB_0010e7e6;
        }
LAB_0010e8a4:
        iVar46 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar46 - 0x401U < 0xfffffc00) {
          pcVar36 = "bad header";
          goto LAB_00110a8c;
        }
        if (((int)sVar21 < iVar46) || (0x400 < (int)(sVar21 - iVar46))) {
          pcVar36 = "bad offset";
          goto LAB_00110a8c;
        }
        local_96b0 = (stbi__uint16 *)CONCAT44(local_96b0._4_4_,uVar72);
        stbi__skip(s,sVar21 - iVar46);
        uVar49 = 0;
        bVar74 = true;
        if (uVar25 != 0x18 || sVar23 != 0xff000000) {
          bVar9 = true;
          uVar72 = (uint)local_96b0;
          goto LAB_0010e7fa;
        }
        iVar46 = 3;
        bVar9 = true;
      }
      s->img_n = iVar46;
      sVar30 = s->img_x;
      c = s->img_y;
      iVar46 = stbi__mad3sizes_valid(4,sVar30,c,0);
      if (iVar46 == 0) goto LAB_0010f20a;
      pvVar42 = stbi__malloc_mad3(4,sVar30,c,0);
      if (pvVar42 != (void *)0x0) {
        local_96c0 = CONCAT44(local_96c0._4_4_,uVar71);
        if (uVar25 < 0x10) {
          iVar46 = (int)uVar49;
          if (!bVar9 && iVar46 < 0x101) {
            uVar69 = 0;
            uVar62 = 0;
            if (0 < iVar46) {
              uVar62 = uVar49;
            }
            for (; uVar62 != uVar69; uVar69 = uVar69 + 1) {
              sVar13 = stbi__get8(s);
              *(stbi_uc *)((long)packets + uVar69 * 4 + 2) = sVar13;
              sVar13 = stbi__get8(s);
              *(stbi_uc *)((long)packets + uVar69 * 4 + 1) = sVar13;
              sVar13 = stbi__get8(s);
              *(stbi_uc *)((long)packets + uVar69 * 4) = sVar13;
              if (sVar22 != 0xc) {
                stbi__get8(s);
              }
              *(undefined1 *)((long)packets + uVar69 * 4 + 3) = 0xff;
            }
            stbi__skip(s,(sVar21 - sVar22) + iVar20 + iVar46 * (sVar22 == 0xc | 0xfffffffc));
            if (uVar25 == 1) {
              sVar22 = s->img_x;
              iVar20 = 0;
              lVar40 = 0;
LAB_0011010c:
              sVar21 = s->img_y;
              if (iVar20 < (int)sVar21) {
                bVar11 = stbi__get8(s);
                lVar40 = (long)(int)lVar40;
                iVar46 = 0;
                do {
                  sVar21 = s->img_x;
                  iVar64 = 8;
                  do {
                    if ((int)sVar21 <= iVar46) {
LAB_00110194:
                      stbi__skip(s,-(sVar22 + 7 >> 3) & 3);
                      iVar20 = iVar20 + 1;
                      goto LAB_0011010c;
                    }
                    uVar49 = (ulong)((bVar11 >> (iVar64 - 1U & 0x1f) & 1) != 0);
                    *(undefined1 *)((long)pvVar42 + lVar40) =
                         *(undefined1 *)((long)packets + uVar49 * 4);
                    *(undefined1 *)((long)pvVar42 + lVar40 + 1) =
                         *(undefined1 *)((long)packets + uVar49 * 4 + 1);
                    *(undefined1 *)((long)pvVar42 + lVar40 + 2) =
                         *(undefined1 *)((long)packets + uVar49 * 4 + 2);
                    *(undefined1 *)((long)pvVar42 + lVar40 + 3) = 0xff;
                    lVar40 = lVar40 + 4;
                    if (sVar21 - 1 == iVar46) goto LAB_00110194;
                    iVar46 = iVar46 + 1;
                    iVar31 = iVar64 + -1;
                    bVar74 = 0 < iVar64;
                    iVar64 = iVar31;
                  } while (iVar31 != 0 && bVar74);
                  bVar11 = stbi__get8(s);
                } while( true );
              }
            }
            else {
              if (uVar25 == 8) {
                sVar22 = s->img_x;
              }
              else {
                if (uVar25 != 4) {
                  free(pvVar42);
                  pcVar36 = "bad bpp";
                  goto LAB_00110a8c;
                }
                sVar22 = s->img_x + 1 >> 1;
              }
              lVar40 = 0;
              for (iVar20 = 0; sVar21 = s->img_y, iVar20 < (int)sVar21; iVar20 = iVar20 + 1) {
                lVar40 = (long)(int)lVar40 + 4;
                for (iVar46 = 0; iVar46 < (int)s->img_x; iVar46 = iVar46 + 2) {
                  bVar18 = stbi__get8(s);
                  bVar11 = bVar18 >> 4;
                  if (uVar25 != 4) {
                    bVar11 = bVar18;
                  }
                  uVar49 = (ulong)bVar11;
                  *(undefined1 *)((long)pvVar42 + lVar40 + -4) =
                       *(undefined1 *)((long)packets + uVar49 * 4);
                  *(undefined1 *)((long)pvVar42 + lVar40 + -3) =
                       *(undefined1 *)((long)packets + uVar49 * 4 + 1);
                  *(undefined1 *)((long)pvVar42 + lVar40 + -2) =
                       *(undefined1 *)((long)packets + uVar49 * 4 + 2);
                  *(undefined1 *)((long)pvVar42 + lVar40 + -1) = 0xff;
                  if (iVar46 + 1U == s->img_x) goto LAB_00110290;
                  uVar72 = bVar18 & 0xf;
                  if (uVar25 != 4) {
                    uVar72 = 0;
                  }
                  if (uVar25 == 8) {
                    bVar11 = stbi__get8(s);
                    uVar72 = (uint)bVar11;
                  }
                  uVar49 = (ulong)uVar72;
                  *(undefined1 *)((long)pvVar42 + lVar40) =
                       *(undefined1 *)((long)packets + uVar49 * 4);
                  *(undefined1 *)((long)pvVar42 + lVar40 + 1) =
                       *(undefined1 *)((long)packets + uVar49 * 4 + 1);
                  *(undefined1 *)((long)pvVar42 + lVar40 + 2) =
                       *(undefined1 *)((long)packets + uVar49 * 4 + 2);
                  *(undefined1 *)((long)pvVar42 + lVar40 + 3) = 0xff;
                  lVar40 = lVar40 + 8;
                }
                lVar40 = lVar40 + -4;
LAB_00110290:
                stbi__skip(s,-sVar22 & 3);
              }
            }
            goto LAB_00110002;
          }
          free(pvVar42);
          pcVar36 = "invalid";
          goto LAB_00110a8c;
        }
        stbi__skip(s,(sVar21 - sVar22) + iVar20);
        uVar72 = local_96a8._4_4_;
        sVar63 = (short)uVar25;
        if (sVar63 != 0x10) {
          if (sVar63 == 0x20) {
            uVar72 = uVar26 ^ 0xff0000 | uVar27 ^ 0xff00 | uVar28 ^ 0xff;
            local_96a8 = (ulong)local_96a8._4_4_ << 0x20;
            if ((bool)(bVar74 & uVar72 == 0)) {
              local_96c8 = (stbi_uc *)
                           CONCAT44(local_96c8._4_4_,(int)CONCAT71((uint7)(uint3)(uVar72 >> 8),1));
              goto LAB_0010fb08;
            }
            goto LAB_0010fb74;
          }
          local_96a8 = (ulong)local_96a8._4_4_ << 0x20;
          if (sVar63 != 0x18) goto LAB_0010fb74;
          local_96a8 = CONCAT44(uVar72,s->img_x) & 0xffffffff00000003;
          local_96c8 = (stbi_uc *)((ulong)local_96c8._4_4_ << 0x20);
LAB_0010fb08:
          bVar74 = false;
          iVar20 = 0;
          iVar46 = 0;
          iVar64 = 0;
          local_9698 = local_9698 & 0xffffffff00000000;
          uVar72 = 0;
          local_96b8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_96b8 & 0xffffffff00000000);
          local_96a0 = (stbi__uint16 *)((ulong)local_96a0 & 0xffffffff00000000);
          local_96cc = 0;
LAB_0010fe7f:
          lVar40 = 0;
          uVar49 = 0;
          uVar29 = (uint)local_96c0;
          while (sVar21 = s->img_y, (int)uVar49 < (int)sVar21) {
            lVar40 = (long)(int)lVar40;
            local_96c0 = uVar49;
            if (bVar74) {
              for (iVar31 = 0; iVar31 < (int)s->img_x; iVar31 = iVar31 + 1) {
                if (uVar25 == 0x10) {
                  uVar53 = stbi__get16le(s);
                }
                else {
                  uVar53 = stbi__get32le(s);
                }
                iVar33 = stbi__shiftsigned(uVar53 & uVar26,iVar20,uVar72);
                *(char *)((long)pvVar42 + lVar40) = (char)iVar33;
                iVar33 = stbi__shiftsigned(uVar53 & uVar27,iVar46,(int)local_96b8);
                *(char *)((long)pvVar42 + lVar40 + 1) = (char)iVar33;
                iVar33 = stbi__shiftsigned(uVar53 & uVar28,iVar64,(int)local_96a0);
                *(char *)((long)pvVar42 + lVar40 + 2) = (char)iVar33;
                if (sVar23 == 0) {
                  uVar53 = 0xff;
                }
                else {
                  uVar53 = stbi__shiftsigned(uVar53 & sVar23,(int)local_9698,local_96cc);
                }
                uVar29 = uVar29 | uVar53;
                *(char *)((long)pvVar42 + lVar40 + 3) = (char)uVar53;
                lVar40 = lVar40 + 4;
              }
            }
            else {
              for (iVar31 = 0; iVar31 < (int)s->img_x; iVar31 = iVar31 + 1) {
                sVar13 = stbi__get8(s);
                *(stbi_uc *)((long)pvVar42 + lVar40 + 2) = sVar13;
                sVar13 = stbi__get8(s);
                *(stbi_uc *)((long)pvVar42 + lVar40 + 1) = sVar13;
                sVar13 = stbi__get8(s);
                *(stbi_uc *)((long)pvVar42 + lVar40) = sVar13;
                bVar11 = 0xff;
                if ((char)local_96c8 != '\0') {
                  bVar11 = stbi__get8(s);
                }
                uVar29 = uVar29 | bVar11;
                *(byte *)((long)pvVar42 + lVar40 + 3) = bVar11;
                lVar40 = lVar40 + 4;
              }
            }
            stbi__skip(s,(int)local_96a8);
            uVar49 = (ulong)((int)local_96c0 + 1);
          }
          local_96c0 = (ulong)uVar29;
LAB_00110002:
          if ((uint)local_96c0 == 0) {
            for (uVar25 = s->img_x * sVar21 * 4 - 1; -1 < (int)uVar25; uVar25 = uVar25 - 4) {
              *(undefined1 *)((long)pvVar42 + (ulong)uVar25) = 0xff;
            }
          }
          if (0 < (int)(uint)local_96b0) {
            iVar20 = (int)sVar21 >> 1;
            if ((int)sVar21 >> 1 < 1) {
              iVar20 = 0;
            }
            iVar46 = sVar21 * 4;
            iVar64 = 0;
            for (iVar31 = 0; iVar46 = iVar46 + -4, iVar31 != iVar20; iVar31 = iVar31 + 1) {
              sVar21 = s->img_x;
              uVar49 = (ulong)(sVar21 * 4);
              if ((int)(sVar21 * 4) < 1) {
                uVar49 = 0;
              }
              for (uVar62 = 0; uVar49 != uVar62; uVar62 = uVar62 + 1) {
                uVar45 = *(undefined1 *)((long)pvVar42 + uVar62 + sVar21 * iVar64);
                *(undefined1 *)((long)pvVar42 + uVar62 + sVar21 * iVar64) =
                     *(undefined1 *)((long)pvVar42 + uVar62 + sVar21 * iVar46);
                *(undefined1 *)((long)pvVar42 + uVar62 + sVar21 * iVar46) = uVar45;
              }
              iVar64 = iVar64 + 4;
            }
          }
          *x = s->img_x;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return pvVar42;
          }
          return pvVar42;
        }
        local_96a8 = CONCAT44(local_96a8._4_4_,s->img_x * 2) & 0xffffffff00000002;
LAB_0010fb74:
        if ((uVar27 != 0 && uVar26 != 0) && uVar28 != 0) {
          iVar20 = stbi__high_bit(uVar26);
          uVar72 = stbi__bitcount(uVar26);
          iVar46 = stbi__high_bit(uVar27);
          uVar29 = stbi__bitcount(uVar27);
          iVar64 = stbi__high_bit(uVar28);
          uVar53 = stbi__bitcount(uVar28);
          iVar31 = stbi__high_bit(sVar23);
          local_9698 = CONCAT44(local_9698._4_4_,iVar31);
          local_96cc = stbi__bitcount(sVar23);
          local_96b8 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_96b8._4_4_,uVar29);
          local_96a0 = (stbi__uint16 *)CONCAT44(local_96a0._4_4_,uVar53);
          if ((local_96cc < 9 && uVar53 < 9) && (uVar29 < 9 && uVar72 < 9)) {
            iVar20 = iVar20 + -7;
            iVar46 = iVar46 + -7;
            iVar64 = iVar64 + -7;
            local_9698 = CONCAT44(local_9698._4_4_,(int)local_9698 + -7);
            bVar74 = true;
            local_96c8 = (stbi_uc *)((ulong)local_96c8._4_4_ << 0x20);
            goto LAB_0010fe7f;
          }
        }
        free(pvVar42);
        pcVar36 = "bad masks";
        goto LAB_00110a8c;
      }
      goto LAB_00110a85;
    }
LAB_0010f20a:
    pcVar36 = "too large";
LAB_00110a8c:
    *(char **)(in_FS_OFFSET + -8) = pcVar36;
    return (void *)0x0;
  }
LAB_0010bdd6:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  sVar13 = stbi__get8(s);
  if (((((sVar13 == 'G') && (sVar13 = stbi__get8(s), sVar13 == 'I')) &&
       (sVar13 = stbi__get8(s), sVar13 == 'F')) && (sVar13 = stbi__get8(s), sVar13 == '8')) &&
     ((sVar13 = stbi__get8(s), sVar13 == '9' || (sVar13 == '7')))) {
    sVar13 = stbi__get8(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar13 == 'a') {
      memset(packets,0,0x8870);
      sVar13 = stbi__get8(s);
      if ((((sVar13 == 'G') && (sVar13 = stbi__get8(s), sVar13 == 'I')) &&
          ((sVar13 = stbi__get8(s), sVar13 == 'F' && (sVar13 = stbi__get8(s), sVar13 == '8')))) &&
         (((sVar13 = stbi__get8(s), sVar13 == '7' || (sVar13 == '9')) &&
          (sVar13 = stbi__get8(s), sVar13 == 'a')))) {
        *(char **)(in_FS_OFFSET + -8) = "";
        iVar46 = stbi__get16le(s);
        uVar19 = (undefined3)iVar46;
        packets[0].size = (char)uVar19;
        packets[0].type = (char)((uint3)uVar19 >> 8);
        packets[0].channel = (char)((uint3)uVar19 >> 0x10);
        packets[1].size = (char)((uint)iVar46 >> 0x18);
        iVar20 = stbi__get16le(s);
        packets[1].type = (char)iVar20;
        packets[1].channel = (char)((uint)iVar20 >> 8);
        packets[2].size = (char)((uint)iVar20 >> 0x10);
        packets[2].type = (char)((uint)iVar20 >> 0x18);
        bVar11 = stbi__get8(s);
        local_8888 = (stbi_uc *)CONCAT44(local_8888._4_4_,(uint)bVar11);
        sVar13 = stbi__get8(s);
        local_8888 = (stbi_uc *)(ulong)CONCAT14(sVar13,(int)local_8888);
        bVar18 = stbi__get8(s);
        local_8880 = (stbi_uc *)CONCAT44(0xffffffff,(uint)bVar18);
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        if ((char)bVar11 < '\0') {
          stbi__gif_parse_colortable
                    (s,(stbi_uc (*) [4])((long)&local_8878 + 4),2 << (bVar11 & 7),-1);
          iVar20 = packets._4_4_;
          iVar46 = packets._0_4_;
        }
        iVar64 = stbi__mad3sizes_valid(4,iVar46,iVar20,0);
        if (iVar64 == 0) {
          pcVar36 = "too large";
        }
        else {
          iVar64 = iVar46 * iVar20;
          sVar48 = (size_t)(iVar64 * 4);
          pvVar42 = malloc(sVar48);
          packets._8_8_ = pvVar42;
          pvVar35 = malloc(sVar48);
          packets._16_8_ = pvVar35;
          psVar39 = (stbi_uc *)malloc((long)iVar64);
          unique0x10006bfc = psVar39;
          if ((pvVar42 == (void *)0x0) || (pvVar35 == (void *)0x0 || psVar39 == (stbi_uc *)0x0)) {
            pcVar36 = "outofmem";
          }
          else {
            memset(pvVar42,0,sVar48);
            memset(pvVar35,0,sVar48);
            psVar73 = (stbi__uint16 *)((long)&local_8878 + 4);
            uVar49 = (ulong)local_8880 >> 0x20;
            memset(psVar39,0,(long)iVar64);
            while( true ) {
              sVar13 = stbi__get8(s);
              if (sVar13 != '!') break;
              sVar13 = stbi__get8(s);
              if (sVar13 == 0xf9) {
                bVar11 = stbi__get8(s);
                if (bVar11 == 4) {
                  bVar11 = stbi__get8(s);
                  local_8878 = (stbi_uc *)CONCAT44(local_8878._4_4_,(uint)bVar11);
                  local_40 = stbi__get16le(s);
                  local_40 = local_40 * 10;
                  if (-1 < (int)(uint)uVar49) {
                    *(undefined1 *)((long)&local_8878 + uVar49 * 4 + 7) = 0xff;
                  }
                  if ((bVar11 & 1) == 0) {
                    stbi__skip(s,1);
                    local_8880 = (stbi_uc *)CONCAT44(0xffffffff,(int)local_8880);
                    uVar49 = 0xffffffff;
                  }
                  else {
                    bVar11 = stbi__get8(s);
                    uVar49 = (ulong)bVar11;
                    local_8880 = (stbi_uc *)(ulong)CONCAT14(bVar11,(int)local_8880);
                    *(undefined1 *)((long)&local_8878 + uVar49 * 4 + 7) = 0;
                  }
                  goto LAB_0010f92a;
                }
                stbi__skip(s,(uint)bVar11);
              }
              else {
LAB_0010f92a:
                while (bVar11 = stbi__get8(s), bVar11 != 0) {
                  stbi__skip(s,(uint)bVar11);
                }
              }
            }
            if (sVar13 == ';') goto LAB_0010deff;
            if (sVar13 == ',') {
              iVar64 = stbi__get16le(s);
              iVar31 = stbi__get16le(s);
              iVar33 = stbi__get16le(s);
              iVar32 = stbi__get16le(s);
              if ((iVar46 < iVar33 + iVar64) || (iVar20 < iVar32 + iVar31)) {
                pcVar36 = "bad Image Descriptor";
              }
              else {
                iVar20 = iVar46 * 4;
                local_5c = iVar64 << 2;
                local_58 = iVar31 * iVar20;
                local_54 = (iVar33 + iVar64) * 4;
                local_50 = (iVar32 + iVar31) * iVar20;
                local_48 = local_50;
                if (iVar33 != 0) {
                  local_48 = local_58;
                }
                local_4c = local_5c;
                local_44 = iVar20;
                bVar11 = stbi__get8(s);
                local_60 = (uint)bVar11;
                local_64 = iVar46 << 5;
                if ((bVar11 & 0x40) == 0) {
                  local_64 = iVar20;
                }
                local_68 = (int)(local_60 << 0x19) >> 0x1f & 3;
                if ((char)bVar11 < '\0') {
                  psVar73 = local_886c.fast + 0x1fc;
                  stbi__gif_parse_colortable
                            (s,(stbi_uc (*) [4])psVar73,2 << (bVar11 & 7),
                             -(uint)(((ulong)local_8878 & 1) == 0) | (uint)uVar49);
                }
                else if (((ulong)local_8888 & 0x80) == 0) {
                  pcVar36 = "missing color table";
                  goto LAB_0010def6;
                }
                local_70 = psVar73;
                bVar11 = stbi__get8(s);
                if (0xc < bVar11) goto LAB_0010deff;
                uVar25 = 1 << (bVar11 & 0x1f);
                for (uVar49 = 0; uVar25 != uVar49; uVar49 = uVar49 + 1) {
                  local_8088[0].fast[uVar49 * 2 + 10] = 0xffff;
                  *(char *)(local_8088[0].fast + uVar49 * 2 + 0xb) = (char)uVar49;
                  *(char *)((long)local_8088[0].fast + uVar49 * 4 + 0x17) = (char)uVar49;
                }
                uVar29 = (2 << (bVar11 & 0x1f)) - 1;
                uVar53 = 0;
                uVar72 = 0;
                iVar20 = 0;
                bVar74 = false;
                uVar26 = 0xffffffff;
                uVar27 = uVar25 + 2;
                iVar46 = bVar11 + 1;
                uVar28 = uVar29;
                while( true ) {
                  do {
                    for (; uVar55 = uVar28, iVar64 = iVar46, uVar65 = uVar27, uVar56 = uVar26,
                        bVar9 = bVar74, iVar46 = iVar20 - iVar64, iVar20 < iVar64;
                        iVar20 = iVar20 + 8) {
                      if (uVar53 == 0) {
                        bVar18 = stbi__get8(s);
                        if (bVar18 == 0) goto LAB_00110932;
                        uVar53 = (uint)bVar18;
                      }
                      uVar53 = uVar53 - 1;
                      bVar18 = stbi__get8(s);
                      uVar72 = uVar72 | (uint)bVar18 << ((byte)iVar20 & 0x1f);
                      bVar74 = bVar9;
                      uVar26 = uVar56;
                      uVar27 = uVar65;
                      iVar46 = iVar64;
                      uVar28 = uVar55;
                    }
                    uVar26 = (int)uVar72 >> ((byte)iVar64 & 0x1f);
                    uVar66 = uVar72 & uVar55;
                    uVar72 = uVar26;
                    iVar20 = iVar46;
                    bVar74 = true;
                    uVar26 = 0xffffffff;
                    uVar27 = uVar25 + 2;
                    iVar46 = bVar11 + 1;
                    uVar28 = uVar29;
                  } while (uVar66 == uVar25);
                  if (uVar66 == uVar25 + 1) goto LAB_00110919;
                  if ((int)uVar65 < (int)uVar66) break;
                  if (!bVar9) {
                    pcVar36 = "no clear code";
                    goto LAB_0010def6;
                  }
                  if ((int)uVar56 < 0) {
                    if (uVar66 == uVar65) break;
                  }
                  else {
                    if (0x1fff < (int)uVar65) {
                      pcVar36 = "too many codes";
                      goto LAB_0010def6;
                    }
                    lVar40 = (long)(int)uVar65;
                    uVar65 = uVar65 + 1;
                    local_8088[0].fast[lVar40 * 2 + 10] = (stbi__uint16)uVar56;
                    uVar45 = (undefined1)local_8088[0].fast[(ulong)uVar56 * 2 + 0xb];
                    *(undefined1 *)(local_8088[0].fast + lVar40 * 2 + 0xb) = uVar45;
                    if (uVar66 != uVar65) {
                      uVar45 = (undefined1)local_8088[0].fast[(long)(int)uVar66 * 2 + 0xb];
                    }
                    *(undefined1 *)((long)local_8088[0].fast + lVar40 * 4 + 0x17) = uVar45;
                  }
                  stbi__out_gif_code((stbi__gif *)packets,(stbi__uint16)uVar66);
                  bVar74 = true;
                  uVar26 = uVar66;
                  uVar27 = uVar65;
                  iVar46 = iVar64 + 1;
                  uVar28 = ~(-1 << ((byte)(iVar64 + 1) & 0x1f));
                  if (0xfff < (int)uVar65 || (uVar65 & uVar55) != 0) {
                    iVar46 = iVar64;
                    uVar28 = uVar55;
                  }
                }
                pcVar36 = "illegal code in raster";
              }
            }
            else {
              pcVar36 = "unknown code";
            }
          }
        }
      }
      else {
        pcVar36 = "not GIF";
      }
LAB_0010def6:
      *(char **)(in_FS_OFFSET + -8) = pcVar36;
      goto LAB_0010deff;
    }
  }
  else {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  sVar21 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar21 == 0x38425053) {
    sVar21 = stbi__get32be(s);
    if (sVar21 != 0x38425053) {
      pcVar36 = "not PSD";
      goto LAB_00110a8c;
    }
    iVar20 = stbi__get16be(s);
    if (iVar20 != 1) {
      pcVar36 = "wrong version";
      goto LAB_00110a8c;
    }
    stbi__skip(s,6);
    uVar25 = stbi__get16be(s);
    if (0x10 < uVar25) {
      pcVar36 = "wrong channel count";
      goto LAB_00110a8c;
    }
    sVar21 = stbi__get32be(s);
    sVar22 = stbi__get32be(s);
    if (((int)sVar21 < 0x1000001) && ((int)sVar22 < 0x1000001)) {
      uVar72 = stbi__get16be(s);
      if (((short)uVar72 != 8) && ((uVar72 & 0xffff) != 0x10)) {
        pcVar36 = "unsupported bit depth";
        goto LAB_00110a8c;
      }
      iVar20 = stbi__get16be(s);
      if (iVar20 != 3) {
        pcVar36 = "wrong color format";
        goto LAB_00110a8c;
      }
      sVar23 = stbi__get32be(s);
      stbi__skip(s,sVar23);
      sVar23 = stbi__get32be(s);
      stbi__skip(s,sVar23);
      sVar23 = stbi__get32be(s);
      stbi__skip(s,sVar23);
      uVar26 = stbi__get16be(s);
      if (1 < uVar26) {
        pcVar36 = "bad compression";
        goto LAB_00110a8c;
      }
      iVar20 = stbi__mad3sizes_valid(4,sVar22,sVar21,0);
      if (iVar20 != 0) {
        uVar27 = sVar22 * sVar21;
        pvVar42 = malloc((long)(int)(uVar27 * 4));
        if (pvVar42 != (void *)0x0) {
          if (uVar26 == 0) {
            uVar49 = 0;
            pvVar35 = pvVar42;
            pvVar68 = pvVar42;
            uVar26 = 0;
            if (0 < (int)uVar27) {
              uVar26 = uVar27;
            }
            for (; uVar49 != 4; uVar49 = uVar49 + 1) {
              if (uVar49 < uVar25) {
                if (*piVar58 == 0x10) {
                  for (lVar40 = 0; uVar26 != (uint)lVar40; lVar40 = lVar40 + 1) {
                    iVar20 = stbi__get16be(s);
                    *(short *)((long)pvVar68 + lVar40 * 8) = (short)iVar20;
                  }
                }
                else if (uVar72 == 0x10) {
                  for (lVar40 = 0; uVar26 != (uint)lVar40; lVar40 = lVar40 + 1) {
                    iVar20 = stbi__get16be(s);
                    *(char *)((long)pvVar35 + lVar40 * 4) = (char)((uint)iVar20 >> 8);
                  }
                }
                else {
                  for (lVar40 = 0; uVar26 != (uint)lVar40; lVar40 = lVar40 + 1) {
                    sVar13 = stbi__get8(s);
                    *(stbi_uc *)((long)pvVar35 + lVar40 * 4) = sVar13;
                  }
                }
              }
              else {
                for (lVar40 = 0; uVar26 != (uint)lVar40; lVar40 = lVar40 + 1) {
                  *(char *)((long)pvVar35 + lVar40 * 4) = -(uVar49 == 3);
                }
              }
              pvVar35 = (void *)((long)pvVar35 + 1);
              pvVar68 = (void *)((long)pvVar68 + 2);
            }
          }
          else {
            stbi__skip(s,sVar21 * uVar25 * 2);
            uVar49 = 0;
            pvVar35 = pvVar42;
            uVar72 = 0;
            if (0 < (int)uVar27) {
              uVar72 = uVar27;
            }
            for (; uVar49 != 4; uVar49 = uVar49 + 1) {
              if (uVar49 < uVar25) {
                psVar39 = (stbi_uc *)(uVar49 + (long)pvVar42);
                iVar20 = 0;
                do {
                  uVar26 = uVar27 - iVar20;
                  do {
                    if ((int)uVar26 < 1) goto LAB_0010e410;
                    bVar11 = stbi__get8(s);
                  } while (bVar11 == 0x80);
                  uVar28 = (uint)bVar11;
                  if ((char)bVar11 < '\0') {
                    uVar29 = 0x101 - uVar28;
                    if (uVar26 < uVar29) goto LAB_0010f357;
                    sVar13 = stbi__get8(s);
                    for (iVar46 = uVar28 - 0x101; iVar46 != 0; iVar46 = iVar46 + 1) {
                      *psVar39 = sVar13;
                      psVar39 = psVar39 + 4;
                    }
                  }
                  else {
                    if (uVar26 <= bVar11) {
LAB_0010f357:
                      free(pvVar42);
                      pcVar36 = "corrupt";
                      goto LAB_00110a8c;
                    }
                    uVar29 = uVar28 + 1;
                    uVar26 = uVar29;
                    while (bVar74 = uVar26 != 0, uVar26 = uVar26 - 1, bVar74) {
                      sVar13 = stbi__get8(s);
                      *psVar39 = sVar13;
                      psVar39 = psVar39 + 4;
                    }
                  }
                  iVar20 = iVar20 + uVar29;
                } while( true );
              }
              for (lVar40 = 0; uVar72 != (uint)lVar40; lVar40 = lVar40 + 1) {
                *(char *)((long)pvVar35 + lVar40 * 4) = -(uVar49 == 3);
              }
LAB_0010e410:
              pvVar35 = (void *)((long)pvVar35 + 1);
            }
          }
          if (3 < uVar25) {
            uVar49 = 0;
            if (0 < (int)uVar27) {
              uVar49 = (ulong)uVar27;
            }
            if (*piVar58 == 0x10) {
              for (uVar62 = 0; uVar49 != uVar62; uVar62 = uVar62 + 1) {
                uVar4 = *(ushort *)((long)pvVar42 + uVar62 * 8 + 6);
                if ((uVar4 != 0) && (uVar4 != 0xffff)) {
                  fVar76 = 1.0 / ((float)uVar4 / 65535.0);
                  fVar75 = (1.0 - fVar76) * 65535.0;
                  uVar25 = *(uint *)((long)pvVar42 + uVar62 * 8);
                  auVar77._0_4_ = (int)(fVar75 + fVar76 * (float)(uVar25 & 0xffff));
                  auVar77._4_4_ = (int)(fVar75 + fVar76 * (float)(uVar25 >> 0x10));
                  auVar77._8_4_ = (int)(fVar75 + fVar76 * 0.0);
                  auVar77._12_4_ = (int)(fVar75 + fVar76 * 0.0);
                  auVar77 = pshuflw(auVar77,auVar77,0xe8);
                  *(int *)((long)pvVar42 + uVar62 * 8) = auVar77._0_4_;
                  *(short *)((long)pvVar42 + (uVar62 * 2 + 1) * 4) =
                       (short)(int)((float)*(ushort *)((long)pvVar42 + (uVar62 * 2 + 1) * 4) *
                                    fVar76 + fVar75);
                }
              }
            }
            else {
              for (uVar62 = 0; uVar49 != uVar62; uVar62 = uVar62 + 1) {
                bVar11 = *(byte *)((long)pvVar42 + uVar62 * 4 + 3);
                if ((bVar11 != 0) && (bVar11 != 0xff)) {
                  fVar76 = 1.0 / ((float)bVar11 / 255.0);
                  fVar75 = (1.0 - fVar76) * 255.0;
                  *(char *)((long)pvVar42 + uVar62 * 4) =
                       (char)(int)((float)*(byte *)((long)pvVar42 + uVar62 * 4) * fVar76 + fVar75);
                  *(char *)((long)pvVar42 + uVar62 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)pvVar42 + uVar62 * 4 + 1) * fVar76 +
                                  fVar75);
                  *(char *)((long)pvVar42 + uVar62 * 4 + 2) =
                       (char)(int)((float)*(byte *)((long)pvVar42 + uVar62 * 4 + 2) * fVar76 +
                                  fVar75);
                }
              }
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar21;
          *x = sVar22;
          return pvVar42;
        }
        goto LAB_00110a85;
      }
    }
    goto LAB_0010f20a;
  }
  iVar20 = stbi__pic_is4(s,anon_var_dwarf_c644);
  if (iVar20 != 0) {
    iVar20 = 0x54;
    while (bVar74 = iVar20 != 0, iVar20 = iVar20 + -1, bVar74) {
      stbi__get8(s);
    }
    iVar20 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar20 == 0) goto LAB_0010c189;
    iVar20 = 0x5c;
    while (bVar74 = iVar20 != 0, iVar20 = iVar20 + -1, bVar74) {
      stbi__get8(s);
    }
    uVar25 = stbi__get16be(s);
    uVar72 = stbi__get16be(s);
    iVar20 = stbi__at_eof(s);
    if (iVar20 != 0) {
      pcVar36 = "bad file";
      goto LAB_00110a8c;
    }
    iVar20 = stbi__mad3sizes_valid(uVar25,uVar72,4,0);
    if (iVar20 == 0) goto LAB_0010f20a;
    stbi__get32be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    bVar11 = 0;
    pvVar42 = stbi__malloc_mad3(uVar25,uVar72,4,0);
    if (pvVar42 != (void *)0x0) {
      memset(pvVar42,0xff,(ulong)(uVar25 * 4 * uVar72));
      psVar39 = &packets[0].channel;
      lVar40 = 0;
      do {
        if (lVar40 == 10) goto LAB_0010df53;
        sVar13 = stbi__get8(s);
        bVar18 = stbi__get8(s);
        ((stbi__pic_packet *)(psVar39 + -2))->size = bVar18;
        bVar12 = stbi__get8(s);
        psVar39[-1] = bVar12;
        bVar12 = stbi__get8(s);
        *psVar39 = bVar12;
        iVar20 = stbi__at_eof(s);
        if (iVar20 != 0) goto LAB_0010e0b6;
        if (bVar18 != 8) goto LAB_0010df53;
        bVar11 = bVar11 | bVar12;
        psVar39 = psVar39 + 3;
        lVar40 = lVar40 + 1;
      } while (sVar13 != '\0');
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar11 & 0x10) == 0);
      }
      for (uVar49 = 0; uVar49 != uVar72; uVar49 = uVar49 + 1) {
        psVar39 = (stbi_uc *)((long)(int)(uVar25 * 4 * (int)uVar49) + (long)pvVar42);
        for (lVar52 = 0; lVar40 != lVar52; lVar52 = lVar52 + 1) {
          sVar13 = packets[lVar52].type;
          psVar67 = psVar39;
          uVar26 = uVar25;
          if (sVar13 == '\0') {
            while (bVar74 = uVar26 != 0, uVar26 = uVar26 - 1, bVar74) {
              psVar38 = stbi__readval(s,(uint)packets[lVar52].channel,psVar67);
              if (psVar38 == (stbi_uc *)0x0) goto LAB_0010e0c6;
              psVar67 = psVar67 + 4;
            }
          }
          else if (sVar13 == '\x01') {
            for (; 0 < (int)uVar26; uVar26 = uVar26 - (uVar27 & 0xff)) {
              bVar11 = stbi__get8(s);
              iVar20 = stbi__at_eof(s);
              if (iVar20 != 0) goto LAB_0010e0b6;
              psVar38 = stbi__readval(s,(uint)packets[lVar52].channel,(stbi_uc *)&z_codelength);
              if (psVar38 == (stbi_uc *)0x0) goto LAB_0010e0c6;
              uVar27 = (uint)bVar11;
              if (uVar26 < bVar11) {
                uVar27 = uVar26;
              }
              uVar28 = uVar27 & 0xff;
              while (bVar74 = uVar28 != 0, uVar28 = uVar28 - 1, bVar74) {
                stbi__copyval((uint)packets[lVar52].channel,psVar67,(stbi_uc *)&z_codelength);
                psVar67 = psVar67 + 4;
              }
            }
          }
          else {
            if (sVar13 != '\x02') goto LAB_0010df53;
            for (; 0 < (int)uVar26; uVar26 = uVar26 - iVar20) {
              bVar11 = stbi__get8(s);
              iVar20 = stbi__at_eof(s);
              if (iVar20 != 0) goto LAB_0010e0b6;
              uVar27 = (uint)bVar11;
              if ((char)bVar11 < '\0') {
                if (uVar27 == 0x80) {
                  iVar20 = stbi__get16be(s);
                }
                else {
                  iVar20 = uVar27 - 0x7f;
                }
                if ((int)uVar26 < iVar20) goto LAB_0010e0b6;
                psVar38 = stbi__readval(s,(uint)packets[lVar52].channel,(stbi_uc *)&z_codelength);
                iVar46 = iVar20;
                if (psVar38 == (stbi_uc *)0x0) goto LAB_0010e0c6;
                while (iVar46 != 0) {
                  stbi__copyval((uint)packets[lVar52].channel,psVar67,(stbi_uc *)&z_codelength);
                  psVar67 = psVar67 + 4;
                  iVar46 = iVar46 + -1;
                }
              }
              else {
                iVar20 = bVar11 + 1;
                iVar46 = iVar20;
                if (uVar26 <= uVar27) goto LAB_0010e0b6;
                while (bVar74 = iVar46 != 0, iVar46 = iVar46 + -1, bVar74) {
                  psVar38 = stbi__readval(s,(uint)packets[lVar52].channel,psVar67);
                  if (psVar38 == (stbi_uc *)0x0) goto LAB_0010e0c6;
                  psVar67 = psVar67 + 4;
                }
              }
            }
          }
        }
      }
      goto LAB_0010e0d3;
    }
LAB_00110a85:
    pcVar36 = "outofmem";
    goto LAB_00110a8c;
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_0010c189:
  psVar37 = (stbi__jpeg *)calloc(1,0x4888);
  if (psVar37 == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
LAB_0010c29a:
    sVar13 = stbi__get8(s);
    sVar14 = stbi__get8(s);
    uVar25 = (uint)piVar60;
    if ((sVar13 == 'P') && (0xfd < (byte)(sVar14 - 0x37))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      sVar13 = stbi__get8(s);
      sVar14 = stbi__get8(s);
      if ((byte)(sVar14 - 0x37) < 0xfe || sVar13 != 'P') {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        goto LAB_0010dece;
      }
      s->img_n = (uint)(sVar14 == '6') * 2 + 1;
      sVar13 = stbi__get8(s);
      packets[0].size = sVar13;
      stbi__pnm_skip_whitespace(s,(char *)packets);
      sVar21 = stbi__pnm_getinteger(s,(char *)packets);
      s->img_x = sVar21;
      if (sVar21 == 0) {
LAB_0010debe:
        pcVar36 = "invalid width";
      }
      else {
        stbi__pnm_skip_whitespace(s,(char *)packets);
        sVar21 = stbi__pnm_getinteger(s,(char *)packets);
        s->img_y = sVar21;
        if (sVar21 == 0) goto LAB_0010debe;
        stbi__pnm_skip_whitespace(s,(char *)packets);
        iVar20 = stbi__pnm_getinteger(s,(char *)packets);
        if (iVar20 < 0x10000) {
          *piVar58 = (uint)(0xff < iVar20) * 8 + 8;
          if ((s->img_y < 0x1000001) && (s->img_x < 0x1000001)) {
            *x = s->img_x;
            sVar21 = s->img_y;
            *y = sVar21;
            iVar20 = s->img_n;
            if (comp != (int *)0x0) {
              *comp = iVar20;
              sVar21 = s->img_y;
            }
            sVar22 = s->img_x;
            iVar46 = *piVar58 / 8;
            iVar64 = stbi__mad4sizes_valid(iVar20,sVar22,sVar21,iVar46,uVar25);
            if (iVar64 != 0) {
              psVar73 = (stbi__uint16 *)stbi__malloc_mad4(iVar20,sVar22,sVar21,iVar46,uVar25);
              if (psVar73 != (stbi__uint16 *)0x0) {
                iVar20 = stbi__getn(s,(stbi_uc *)psVar73,sVar21 * iVar20 * sVar22 * iVar46);
                if (iVar20 != 0) {
                  iVar20 = s->img_n;
                  if (iVar20 == 4) {
                    return psVar73;
                  }
                  if (*piVar58 != 0x10) {
                    puVar44 = stbi__convert_format((uchar *)psVar73,iVar20,s->img_x,s->img_y,uVar25)
                    ;
                    return puVar44;
                  }
                  psVar73 = stbi__convert_format16(psVar73,iVar20,s->img_x,s->img_y,uVar25);
                  return psVar73;
                }
                free(psVar73);
                pcVar36 = "bad PNM";
                goto LAB_00110a8c;
              }
              goto LAB_00110a85;
            }
          }
          goto LAB_0010f20a;
        }
        pcVar36 = "max value > 65535";
      }
      *(char **)(in_FS_OFFSET + -8) = pcVar36;
LAB_0010dece:
      *piVar58 = 0;
      return (void *)0x0;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar20 = stbi__hdr_test_core(s,"#?RADIANCE\n");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar20 == 0) {
      iVar20 = stbi__hdr_test_core(s,"#?RGBE\n");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar20 != 0) goto LAB_0010c380;
      stbi__get8(s);
      bVar11 = stbi__get8(s);
      if (1 < bVar11) {
LAB_0010df7a:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_0010df8a:
        pcVar36 = "unknown image type";
        goto LAB_00110a8c;
      }
      bVar18 = stbi__get8(s);
      if (bVar11 == 1) {
        if ((bVar18 & 0xf7) == 1) {
          iVar20 = 4;
          stbi__skip(s,4);
          bVar18 = stbi__get8(s);
          if ((bVar18 < 0x21) && ((0x101018100U >> ((ulong)bVar18 & 0x3f) & 1) != 0))
          goto LAB_0010e215;
        }
        goto LAB_0010df7a;
      }
      if ((bVar18 & 0xf6) != 2) goto LAB_0010df7a;
      iVar20 = 9;
LAB_0010e215:
      stbi__skip(s,iVar20);
      iVar20 = stbi__get16le(s);
      if ((iVar20 == 0) || (iVar20 = stbi__get16le(s), iVar20 == 0)) goto LAB_0010df7a;
      bVar18 = stbi__get8(s);
      if (bVar11 == 1) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar18 - 8 & 0xf7) == 0) goto LAB_0010ee10;
        goto LAB_0010df8a;
      }
      if ((0x20 < bVar18) || ((0x101018100U >> ((ulong)bVar18 & 0x3f) & 1) == 0)) goto LAB_0010df7a;
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_0010ee10:
      bVar18 = stbi__get8(s);
      sVar13 = stbi__get8(s);
      bVar12 = stbi__get8(s);
      iVar20 = stbi__get16le(s);
      uVar25 = stbi__get16le(s);
      bVar11 = stbi__get8(s);
      stbi__get16le(s);
      stbi__get16le(s);
      iVar46 = stbi__get16le(s);
      uVar72 = stbi__get16le(s);
      bVar16 = stbi__get8(s);
      packets._0_8_ = (ulong)(uint)packets._4_4_ << 0x20;
      bVar17 = stbi__get8(s);
      z_codelength.fast._0_8_ = (ulong)(uint)z_codelength.fast._4_4_ << 0x20;
      if (sVar13 == '\0') {
        uVar26 = bVar12 - 8;
        if (bVar12 < 8) {
          uVar26 = (uint)bVar12;
        }
        uVar26 = (uint)(uVar26 == 3);
        bVar11 = bVar16;
      }
      else {
        uVar26 = 0;
      }
      uVar26 = stbi__tga_get_comp((uint)bVar11,uVar26,(int *)packets);
      if (uVar26 == 0) {
        pcVar36 = "bad format";
        goto LAB_00110a8c;
      }
      *x = iVar46;
      *y = uVar72;
      if (comp != (int *)0x0) {
        *comp = uVar26;
      }
      iVar64 = stbi__mad3sizes_valid(iVar46,uVar72,uVar26,0);
      if (iVar64 == 0) goto LAB_0010f20a;
      output = (float *)stbi__malloc_mad3(iVar46,uVar72,uVar26,0);
      if (output == (float *)0x0) goto LAB_00110a85;
      stbi__skip(s,(uint)bVar18);
      uVar49 = (ulong)uVar26;
      if (((sVar13 == '\0') && (bVar12 < 8)) && (packets._0_4_ == 0)) {
        uVar27 = 0;
        uVar25 = uVar72;
        while( true ) {
          uVar25 = uVar25 - 1;
          uVar28 = (uint)piVar60;
          if (uVar25 == 0xffffffff) break;
          uVar28 = uVar27;
          if ((bVar17 >> 5 & 1) == 0) {
            uVar28 = uVar25;
          }
          stbi__getn(s,(stbi_uc *)((long)(int)(uVar28 * uVar26 * iVar46) + (long)output),
                     uVar26 * iVar46);
          uVar27 = uVar27 + 1;
        }
        goto LAB_0010fdf3;
      }
      if (sVar13 == '\0') {
        local_9720 = (float *)0x0;
LAB_0010fc5e:
        bVar74 = true;
        iVar20 = 0;
        uVar27 = 0;
        pfVar70 = output;
        for (uVar62 = 0; uVar28 = (uint)piVar60, uVar62 != uVar72 * iVar46; uVar62 = uVar62 + 1) {
          if (bVar12 < 8) {
LAB_0010fcc9:
            if (sVar13 == '\0') {
              if (packets._0_4_ == 0) {
                for (uVar69 = 0; uVar49 != uVar69; uVar69 = uVar69 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)((long)z_codelength.fast + uVar69) = sVar14;
                }
              }
              else {
                if (uVar26 != 3) {
                  __assert_fail("tga_comp == STBI_rgb",
                                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                                ,0x1777,
                                "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                               );
                }
                stbi__tga_read_rgb16(s,(stbi_uc *)&z_codelength);
              }
            }
            else {
              if (bVar16 == 8) {
                bVar11 = stbi__get8(s);
                uVar28 = (uint)bVar11;
              }
              else {
                uVar28 = stbi__get16le(s);
              }
              if (uVar25 <= uVar28) {
                uVar28 = 0;
              }
              for (uVar69 = 0; uVar49 != uVar69; uVar69 = uVar69 + 1) {
                *(undefined1 *)((long)z_codelength.fast + uVar69) =
                     *(undefined1 *)((long)local_9720 + uVar69 + uVar28 * uVar26);
              }
            }
          }
          else {
            if (iVar20 == 0) {
              bVar11 = stbi__get8(s);
              iVar20 = (bVar11 & 0x7f) + 1;
              uVar27 = (uint)(bVar11 >> 7);
              goto LAB_0010fcc9;
            }
            if (uVar27 == 0 || bVar74) {
              uVar27 = (uint)(uVar27 != 0);
              goto LAB_0010fcc9;
            }
            uVar27 = 1;
          }
          for (uVar69 = 0; uVar49 != uVar69; uVar69 = uVar69 + 1) {
            *(undefined1 *)((long)pfVar70 + uVar69) =
                 *(undefined1 *)((long)z_codelength.fast + uVar69);
          }
          iVar20 = iVar20 + -1;
          pfVar70 = (float *)((long)pfVar70 + uVar49);
          bVar74 = false;
        }
        if ((bVar17 >> 5 & 1) == 0) {
          iVar20 = uVar26 * iVar46;
          iVar64 = (uVar72 - 1) * iVar20;
          uVar25 = 0;
          for (uVar27 = 0; uVar28 = (uint)piVar60, uVar27 != uVar72 + 1 >> 1; uVar27 = uVar27 + 1) {
            piVar60 = (int *)(long)iVar64;
            pfVar70 = output;
            for (iVar31 = iVar20; 0 < iVar31; iVar31 = iVar31 + -1) {
              uVar45 = *(undefined1 *)((long)pfVar70 + (ulong)uVar25);
              *(undefined1 *)((long)pfVar70 + (ulong)uVar25) =
                   *(undefined1 *)((long)pfVar70 + (long)piVar60);
              *(undefined1 *)((long)pfVar70 + (long)piVar60) = uVar45;
              pfVar70 = (float *)((long)pfVar70 + 1);
            }
            uVar25 = uVar25 + iVar20;
            iVar64 = iVar64 - iVar20;
          }
        }
        free(local_9720);
LAB_0010fdf3:
        if ((2 < uVar26) && (packets._0_4_ == 0)) {
          iVar20 = uVar72 * iVar46;
          puVar50 = (undefined1 *)((long)output + 2);
          while (bVar74 = iVar20 != 0, iVar20 = iVar20 + -1, bVar74) {
            uVar45 = puVar50[-2];
            puVar50[-2] = *puVar50;
            *puVar50 = uVar45;
            puVar50 = puVar50 + uVar49;
          }
        }
        if (uVar26 != 4) {
          puVar44 = stbi__convert_format((uchar *)output,uVar26,iVar46,uVar72,uVar28);
          return puVar44;
        }
        return output;
      }
      if (uVar25 == 0) {
LAB_001102ef:
        free(output);
        pcVar36 = "bad palette";
        goto LAB_00110a8c;
      }
      stbi__skip(s,iVar20);
      local_9720 = (float *)stbi__malloc_mad2(uVar25,uVar26,0);
      if (local_9720 != (float *)0x0) {
        if (packets._0_4_ == 0) {
          iVar20 = stbi__getn(s,(stbi_uc *)local_9720,uVar26 * uVar25);
          if (iVar20 == 0) {
            free(output);
            output = local_9720;
            goto LAB_001102ef;
          }
        }
        else {
          if (uVar26 != 3) {
            __assert_fail("tga_comp == STBI_rgb",
                          "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                          ,0x1746,
                          "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                         );
          }
          for (lVar40 = 0; uVar25 * 3 != (int)lVar40; lVar40 = lVar40 + 3) {
            stbi__tga_read_rgb16(s,(stbi_uc *)((long)local_9720 + lVar40));
          }
        }
        goto LAB_0010fc5e;
      }
    }
    else {
LAB_0010c380:
      stbi__hdr_gettoken(s,(char *)packets);
      iVar20 = bcmp(packets,"#?RADIANCE",0xb);
      if ((iVar20 != 0) && (iVar20 = bcmp(packets,"#?RGBE",7), iVar20 != 0)) {
        pcVar36 = "not HDR";
LAB_0010df45:
        *(char **)(in_FS_OFFSET + -8) = pcVar36;
        return (void *)0x0;
      }
      bVar74 = false;
      iVar20 = 1;
      while( true ) {
        stbi__hdr_gettoken(s,(char *)packets);
        iVar46 = (int)piVar60;
        if (packets[0].size == '\0') break;
        iVar46 = bcmp(packets,"FORMAT=32-bit_rle_rgbe",0x17);
        if (iVar46 == 0) {
          bVar74 = true;
        }
      }
      if (!bVar74) {
        pcVar36 = "unsupported format";
        goto LAB_0010df45;
      }
      stbi__hdr_gettoken(s,(char *)packets);
      iVar64 = bcmp(packets,"-Y ",3);
      pcVar36 = "unsupported data layout";
      if (iVar64 != 0) goto LAB_0010df45;
      z_codelength.fast._0_8_ = packets + 1;
      uVar49 = strtol((char *)z_codelength.fast._0_8_,(char **)&z_codelength,10);
      z_codelength.fast._0_8_ = (char *)(z_codelength.fast._0_8_ + 2);
      do {
        pcVar57 = (char *)z_codelength.fast._0_8_;
        z_codelength.fast._0_8_ = pcVar57 + 1;
      } while (pcVar57[-2] == ' ');
      if (((pcVar57[-2] != '+') || (pcVar57[-1] != 'X')) || (*pcVar57 != ' ')) goto LAB_0010df45;
      uVar62 = strtol((char *)z_codelength.fast._0_8_,(char **)0x0,10);
      pcVar36 = "too large";
      iVar64 = (int)uVar49;
      if ((0x1000000 < iVar64) || (uVar25 = (uint)uVar62, 0x1000000 < (int)uVar25))
      goto LAB_0010df45;
      *x = uVar25;
      *y = iVar64;
      if (comp != (int *)0x0) {
        *comp = 3;
      }
      iVar31 = stbi__mad4sizes_valid(uVar25,iVar64,4,4,iVar46);
      if (iVar31 == 0) goto LAB_0010df45;
      output = (float *)stbi__malloc_mad4(uVar25,iVar64,4,4,iVar46);
      pcVar36 = "outofmem";
      if (output == (float *)0x0) goto LAB_0010df45;
      iVar46 = 0;
      if (uVar25 - 0x8000 < 0xffff8008) goto LAB_00110a99;
      local_9758 = (char *)0x0;
      uVar69 = 0;
      if (0 < iVar64) {
        uVar69 = uVar49 & 0xffffffff;
      }
      local_9768 = (stbi__context *)0x0;
      for (local_9738 = 0; local_9738 != uVar69; local_9738 = local_9738 + 1) {
        sVar13 = stbi__get8(s);
        sVar14 = stbi__get8(s);
        sVar15 = stbi__get8(s);
        if (((sVar13 != '\x02') || (sVar14 != '\x02')) || ((char)sVar15 < '\0')) {
          lencodes[0] = sVar13;
          lencodes[1] = sVar14;
          lencodes[2] = sVar15;
          lencodes[3] = stbi__get8(s);
          stbi__hdr_convert(output,lencodes,req_comp_00);
          free(local_9768);
          iVar46 = 0;
          do {
            stbi__getn(s,palette,4);
            stbi__hdr_convert(output + (long)(int)(uVar25 * iVar46 * 4) + (long)(iVar20 * 4),palette
                              ,req_comp_01);
            iVar20 = iVar20 + 1;
            while ((int)uVar25 <= iVar20) {
              iVar46 = iVar46 + 1;
LAB_00110a99:
              iVar20 = 0;
              if (iVar64 <= iVar46) goto LAB_00110aab;
            }
          } while( true );
        }
        sVar13 = stbi__get8(s);
        if (CONCAT11(sVar15,sVar13) != uVar25) {
          free(output);
          free(local_9768);
          pcVar36 = "invalid decoded scanline length";
          goto LAB_0010df45;
        }
        uVar43 = extraout_RDX;
        if ((local_9768 == (stbi__context *)0x0) &&
           (local_9768 = (stbi__context *)stbi__malloc_mad2(uVar25,4,0), uVar43 = extraout_RDX_00,
           local_9768 == (stbi__context *)0x0)) {
          free(output);
          goto LAB_0010df45;
        }
        psVar51 = local_9768;
        for (lVar40 = 0; lVar40 != 4; lVar40 = lVar40 + 1) {
          lVar52 = 0;
          while( true ) {
            iVar46 = (int)lVar52;
            if ((int)uVar25 <= iVar46) break;
            bVar11 = stbi__get8(s);
            uVar26 = (uint)bVar11;
            uVar72 = (uint)bVar11;
            if (bVar11 < 0x81) {
              if ((uVar72 == 0) || (uVar25 - iVar46 < uVar72)) goto LAB_0010f432;
              lVar52 = (long)iVar46;
              uVar43 = extraout_RDX_01;
              while (bVar74 = uVar26 != 0, uVar26 = uVar26 - 1, bVar74) {
                sVar13 = stbi__get8(s);
                *(stbi_uc *)((long)psVar51 + lVar52 * 4) = sVar13;
                lVar52 = lVar52 + 1;
                uVar43 = extraout_RDX_03;
              }
            }
            else {
              sVar13 = stbi__get8(s);
              uVar72 = uVar72 & 0x7f;
              if (uVar25 - iVar46 < uVar72) {
LAB_0010f432:
                free(output);
                free(local_9768);
                pcVar36 = "corrupt";
                goto LAB_0010df45;
              }
              lVar52 = (long)iVar46;
              while (bVar74 = uVar72 != 0, uVar72 = uVar72 - 1, uVar43 = extraout_RDX_02, bVar74) {
                *(stbi_uc *)((long)psVar51 + lVar52 * 4) = sVar13;
                lVar52 = lVar52 + 1;
              }
            }
          }
          psVar51 = (stbi__context *)((long)psVar51 + 1);
        }
        for (lVar40 = 0; (uVar62 & 0xffffffff) << 2 != lVar40; lVar40 = lVar40 + 4) {
          stbi__hdr_convert(output + (uint)((int)local_9758 + (int)lVar40),
                            (stbi_uc *)((long)local_9768 + lVar40),(int)uVar43);
          uVar43 = extraout_RDX_04;
        }
        local_9758 = (char *)((long)local_9758 + uVar62 * 4);
      }
      free(local_9768);
LAB_00110aab:
      iVar20 = *x;
      iVar46 = *y;
      uVar49 = 0;
      pvVar42 = stbi__malloc_mad3(iVar20,iVar46,4,0);
      if (pvVar42 != (void *)0x0) {
        uVar25 = iVar46 * iVar20;
        uVar62 = (ulong)uVar25;
        if ((int)uVar25 < 1) {
          uVar62 = uVar49;
        }
        for (; uVar49 != uVar62; uVar49 = uVar49 + 1) {
          for (lVar40 = 0; lVar40 != 3; lVar40 = lVar40 + 1) {
            dVar7 = pow((double)output[(ulong)((uint)uVar49 & 0x3fffffff) * 4 + lVar40],
                        0.45454543828964233);
            fVar76 = (float)dVar7 * 255.0 + 0.5;
            fVar75 = 0.0;
            if (0.0 <= fVar76) {
              fVar75 = fVar76;
            }
            fVar76 = 255.0;
            if (fVar75 <= 255.0) {
              fVar76 = fVar75;
            }
            *(char *)((long)pvVar42 + lVar40 + (ulong)((uint)uVar49 * 4)) = (char)(int)fVar76;
          }
          fVar76 = output[uVar49 * 4 + 3] * 255.0 + 0.5;
          fVar75 = 0.0;
          if (0.0 <= fVar76) {
            fVar75 = fVar76;
          }
          fVar76 = 255.0;
          if (fVar75 <= 255.0) {
            fVar76 = fVar75;
          }
          *(char *)((long)pvVar42 + uVar49 * 4 + 3) = (char)(int)fVar76;
        }
        free(output);
        return pvVar42;
      }
    }
    free(output);
    goto LAB_00110a85;
  }
  psVar37->s = s;
  psVar37->idct_block_kernel = stbi__idct_simd;
  psVar37->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar37->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar20 = stbi__decode_jpeg_header(psVar37,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar37);
  if (iVar20 == 0) goto LAB_0010c29a;
  psVar37 = (stbi__jpeg *)calloc(1,0x4888);
  if (psVar37 == (stbi__jpeg *)0x0) goto LAB_00110a85;
  psVar37->s = s;
  psVar37->idct_block_kernel = stbi__idct_simd;
  psVar37->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar37->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  for (lVar40 = 0x46d8; lVar40 != 0x4858; lVar40 = lVar40 + 0x60) {
    psVar39 = psVar37->huff_dc[0].fast + lVar40 + -8;
    psVar39[0] = '\0';
    psVar39[1] = '\0';
    psVar39[2] = '\0';
    psVar39[3] = '\0';
    psVar39[4] = '\0';
    psVar39[5] = '\0';
    psVar39[6] = '\0';
    psVar39[7] = '\0';
    psVar39[8] = '\0';
    psVar39[9] = '\0';
    psVar39[10] = '\0';
    psVar39[0xb] = '\0';
    psVar39[0xc] = '\0';
    psVar39[0xd] = '\0';
    psVar39[0xe] = '\0';
    psVar39[0xf] = '\0';
  }
  psVar37->restart_interval = 0;
  iVar20 = stbi__decode_jpeg_header(psVar37,0);
  if (iVar20 == 0) goto LAB_0010ecd4;
  paVar1 = psVar37->img_comp;
  bVar11 = stbi__get_marker(psVar37);
  while (bVar11 == 0xda) {
    iVar20 = stbi__get16be(psVar37->s);
    bVar11 = stbi__get8(psVar37->s);
    uVar25 = (uint)bVar11;
    psVar37->scan_n = (uint)bVar11;
    if (((byte)(bVar11 - 5) < 0xfc) || (psVar51 = psVar37->s, psVar51->img_n < (int)(uint)bVar11)) {
      pcVar36 = "bad SOS component count";
      goto LAB_0010eccb;
    }
    if (iVar20 != (uint)bVar11 * 2 + 6) {
      pcVar36 = "bad SOS len";
      goto LAB_0010eccb;
    }
    lVar40 = 0;
    while( true ) {
      bVar11 = stbi__get8(psVar51);
      if ((int)uVar25 <= lVar40) break;
      bVar18 = stbi__get8(psVar37->s);
      psVar51 = psVar37->s;
      uVar25 = psVar51->img_n;
      uVar49 = 0;
      if (0 < (int)uVar25) {
        uVar49 = (ulong)uVar25;
      }
      paVar59 = paVar1;
      for (uVar62 = 0; uVar49 != uVar62; uVar62 = uVar62 + 1) {
        if (paVar59->id == (uint)bVar11) {
          uVar49 = uVar62 & 0xffffffff;
          break;
        }
        paVar59 = paVar59 + 1;
      }
      if ((uint)uVar49 == uVar25) goto LAB_0010ecd4;
      psVar37->img_comp[uVar49].hd = (uint)(bVar18 >> 4);
      if (0x3f < bVar18) {
        pcVar36 = "bad DC huff";
        goto LAB_0010eccb;
      }
      paVar1[uVar49].ha = bVar18 & 0xf;
      if (3 < (bVar18 & 0xf)) {
        pcVar36 = "bad AC huff";
        goto LAB_0010eccb;
      }
      psVar37->order[lVar40] = (uint)uVar49;
      lVar40 = lVar40 + 1;
      uVar25 = psVar37->scan_n;
    }
    psVar37->spec_start = (uint)bVar11;
    bVar11 = stbi__get8(psVar37->s);
    psVar37->spec_end = (uint)bVar11;
    bVar11 = stbi__get8(psVar37->s);
    psVar37->succ_high = (uint)(bVar11 >> 4);
    psVar37->succ_low = bVar11 & 0xf;
    iVar20 = psVar37->spec_start;
    if (psVar37->progressive == 0) {
      if ((iVar20 != 0) || ((0xf < bVar11 || ((bVar11 & 0xf) != 0)))) {
LAB_0010ecc4:
        pcVar36 = "bad SOS";
        goto LAB_0010eccb;
      }
      psVar37->spec_end = 0x3f;
    }
    else if ((((0x3f < iVar20) || (0x3f < psVar37->spec_end)) || (psVar37->spec_end < iVar20)) ||
            ((0xdf < bVar11 || (0xd < (bVar11 & 0xf))))) goto LAB_0010ecc4;
    stbi__jpeg_reset(psVar37);
    if (psVar37->progressive == 0) {
      if (psVar37->scan_n == 1) {
        iVar20 = psVar37->order[0];
        uVar25 = psVar37->img_comp[iVar20].x + 7 >> 3;
        iVar46 = psVar37->img_comp[iVar20].y + 7 >> 3;
        if ((int)uVar25 < 1) {
          uVar25 = 0;
        }
        iVar64 = 0;
        if (iVar46 < 1) {
          iVar46 = 0;
        }
        for (iVar31 = 0; iVar31 != iVar46; iVar31 = iVar31 + 1) {
          for (lVar40 = 0; (ulong)uVar25 * 8 != lVar40; lVar40 = lVar40 + 8) {
            iVar33 = stbi__jpeg_decode_block
                               (psVar37,(short *)packets,
                                (stbi__huffman *)psVar37->huff_dc[paVar1[iVar20].hd].fast,
                                (stbi__huffman *)psVar37->huff_ac[paVar1[iVar20].ha].fast,
                                psVar37->fast_ac[paVar1[iVar20].ha],iVar20,
                                psVar37->dequant[paVar1[iVar20].tq]);
            if (iVar33 == 0) {
              bVar74 = false;
              goto LAB_0010cf17;
            }
            (*psVar37->idct_block_kernel)
                      (paVar1[iVar20].data + lVar40 + iVar64 * paVar1[iVar20].w2,paVar1[iVar20].w2,
                       (short *)packets);
            iVar33 = psVar37->todo;
            psVar37->todo = iVar33 + -1;
            if (iVar33 < 2) {
              if (psVar37->code_bits < 0x18) {
                stbi__grow_buffer_unsafe(psVar37);
              }
              if ((psVar37->marker & 0xf8) != 0xd0) goto LAB_0010cf14;
              stbi__jpeg_reset(psVar37);
            }
          }
          iVar64 = iVar64 + 8;
        }
LAB_0010cf14:
        bVar74 = true;
      }
      else {
        for (iVar20 = 0; iVar20 < psVar37->img_mcu_y; iVar20 = iVar20 + 1) {
          for (iVar46 = 0; iVar46 < psVar37->img_mcu_x; iVar46 = iVar46 + 1) {
            for (lVar40 = 0; lVar40 < psVar37->scan_n; lVar40 = lVar40 + 1) {
              iVar64 = psVar37->order[lVar40];
              for (iVar31 = 0; iVar31 < paVar1[iVar64].v; iVar31 = iVar31 + 1) {
                for (iVar33 = 0; iVar32 = paVar1[iVar64].h, iVar33 < iVar32; iVar33 = iVar33 + 1) {
                  iVar5 = paVar1[iVar64].v;
                  iVar24 = stbi__jpeg_decode_block
                                     (psVar37,(short *)packets,
                                      (stbi__huffman *)psVar37->huff_dc[paVar1[iVar64].hd].fast,
                                      (stbi__huffman *)psVar37->huff_ac[paVar1[iVar64].ha].fast,
                                      psVar37->fast_ac[paVar1[iVar64].ha],iVar64,
                                      psVar37->dequant[paVar1[iVar64].tq]);
                  if (iVar24 == 0) {
                    bVar74 = false;
                    goto LAB_0010cf17;
                  }
                  (*psVar37->idct_block_kernel)
                            (paVar1[iVar64].data +
                             (long)((iVar32 * iVar46 + iVar33) * 8) +
                             (long)((iVar5 * iVar20 + iVar31) * paVar1[iVar64].w2 * 8),
                             paVar1[iVar64].w2,(short *)packets);
                }
              }
            }
            iVar64 = psVar37->todo;
            psVar37->todo = iVar64 + -1;
            if (iVar64 < 2) {
              if (psVar37->code_bits < 0x18) {
                stbi__grow_buffer_unsafe(psVar37);
              }
              if ((psVar37->marker & 0xf8) != 0xd0) goto LAB_0010cf9f;
              stbi__jpeg_reset(psVar37);
            }
          }
        }
LAB_0010cf9f:
        bVar74 = true;
      }
LAB_0010cf17:
      if (bVar74) goto LAB_0010cf1f;
      goto LAB_0010ecd4;
    }
    if (psVar37->scan_n == 1) {
      local_96a0 = (stbi__uint16 *)(long)psVar37->order[0];
      iVar46 = psVar37->img_comp[(long)local_96a0].x + 7 >> 3;
      iVar20 = psVar37->img_comp[(long)local_96a0].y + 7 >> 3;
      iVar64 = 0;
      if (iVar46 < 1) {
        iVar46 = 0;
      }
      local_96b8 = paVar1 + (long)local_96a0;
      if (iVar20 < 1) {
        iVar20 = iVar64;
      }
      local_96c8 = (stbi_uc *)CONCAT44(local_96c8._4_4_,iVar20);
      for (; iVar64 != iVar20; iVar64 = iVar64 + 1) {
        for (iVar20 = 0; iVar20 != iVar46; iVar20 = iVar20 + 1) {
          psVar47 = local_96b8->coeff + (local_96b8->coeff_w * iVar64 + iVar20) * 0x40;
          uVar49 = (ulong)psVar37->spec_start;
          if (uVar49 == 0) {
            iVar31 = stbi__jpeg_decode_block_prog_dc
                               (psVar37,psVar47,
                                (stbi__huffman *)psVar37->huff_dc[local_96b8->hd].fast,
                                (int)local_96a0);
            if (iVar31 == 0) goto LAB_0010ecd4;
          }
          else {
            iVar31 = local_96b8->ha;
            psVar39 = psVar37->huff_ac[iVar31].fast;
            iVar33 = psVar37->eob_run;
            bVar11 = (byte)psVar37->succ_low;
            if (psVar37->succ_high == 0) {
              if (iVar33 == 0) {
                do {
                  if (psVar37->code_bits < 0x10) {
                    stbi__grow_buffer_unsafe(psVar37);
                  }
                  sVar63 = psVar37->fast_ac[iVar31][psVar37->code_buffer >> 0x17];
                  uVar25 = (uint)sVar63;
                  iVar33 = (int)uVar49;
                  if (sVar63 == 0) {
                    uVar25 = stbi__jpeg_huff_decode(psVar37,(stbi__huffman *)psVar39);
                    if ((int)uVar25 < 0) goto LAB_0010e66d;
                    uVar72 = uVar25 >> 4;
                    if ((uVar25 & 0xf) == 0) {
                      if (uVar25 < 0xf0) {
                        iVar33 = 1 << ((byte)uVar72 & 0x1f);
                        psVar37->eob_run = iVar33;
                        if (0xf < uVar25) {
                          iVar33 = stbi__jpeg_get_bits(psVar37,uVar72);
                          iVar33 = iVar33 + psVar37->eob_run;
                        }
                        goto LAB_0010c817;
                      }
                      uVar49 = (ulong)(iVar33 + 0x10);
                    }
                    else {
                      lVar40 = (ulong)uVar72 + (long)iVar33;
                      uVar49 = (ulong)((int)lVar40 + 1);
                      bVar18 = ""[lVar40];
                      iVar33 = stbi__extend_receive(psVar37,uVar25 & 0xf);
                      psVar47[bVar18] = (short)(iVar33 << (bVar11 & 0x1f));
                    }
                  }
                  else {
                    uVar72 = uVar25 & 0xf;
                    if (psVar37->code_bits < (int)uVar72) goto LAB_0010ecbb;
                    lVar40 = (ulong)(uVar25 >> 4 & 0xf) + (long)iVar33;
                    psVar37->code_buffer = psVar37->code_buffer << (sbyte)uVar72;
                    psVar37->code_bits = psVar37->code_bits - uVar72;
                    uVar49 = (ulong)((int)lVar40 + 1);
                    psVar47[""[lVar40]] = (short)((uVar25 >> 8) << (bVar11 & 0x1f));
                  }
                } while ((int)uVar49 <= psVar37->spec_end);
              }
              else {
LAB_0010c817:
                psVar37->eob_run = iVar33 + -1;
              }
            }
            else if (iVar33 == 0) {
              iVar31 = 0x10000 << (bVar11 & 0x1f);
              do {
                uVar25 = stbi__jpeg_huff_decode(psVar37,(stbi__huffman *)psVar39);
                if ((int)uVar25 < 0) goto LAB_0010e66d;
                uVar72 = uVar25 >> 4;
                if ((uVar25 & 0xf) == 1) {
                  iVar33 = stbi__jpeg_get_bit(psVar37);
                  iVar32 = 1;
                  if (iVar33 == 0) {
                    iVar32 = 0xffff;
                  }
                  sVar63 = (short)(iVar32 << (bVar11 & 0x1f));
                }
                else {
                  if ((uVar25 & 0xf) != 0) goto LAB_0010ecbb;
                  if (uVar25 < 0xf0) {
                    psVar37->eob_run = ~(-1 << ((byte)uVar72 & 0x1f));
                    if (0xf < uVar25) {
                      iVar33 = stbi__jpeg_get_bits(psVar37,uVar72);
                      psVar37->eob_run = psVar37->eob_run + iVar33;
                    }
                    uVar72 = 0x40;
                  }
                  else {
                    uVar72 = 0xf;
                  }
                  sVar63 = 0;
                }
                uVar62 = (long)(int)uVar49;
                do {
                  while( true ) {
                    uVar49 = uVar62;
                    iVar33 = psVar37->spec_end;
                    if ((long)iVar33 < (long)uVar49) goto LAB_0010c949;
                    bVar18 = ""[uVar49];
                    if (psVar47[bVar18] == 0) break;
                    iVar33 = stbi__jpeg_get_bit(psVar37);
                    if ((iVar33 != 0) &&
                       (sVar3 = psVar47[bVar18], (iVar31 >> 0x10 & (int)sVar3) == 0)) {
                      sVar8 = (short)((uint)iVar31 >> 0x10);
                      if (sVar3 < 1) {
                        sVar8 = -sVar8;
                      }
                      psVar47[bVar18] = sVar3 + sVar8;
                    }
                    uVar62 = uVar49 + 1;
                  }
                  bVar74 = uVar72 != 0;
                  uVar72 = uVar72 - 1;
                  uVar62 = uVar49 + 1;
                } while (bVar74);
                psVar47[bVar18] = sVar63;
                uVar49 = uVar49 + 1;
LAB_0010c949:
              } while ((int)uVar49 <= iVar33);
            }
            else {
              psVar37->eob_run = iVar33 + -1;
              uVar25 = (0x10000 << (bVar11 & 0x1f)) >> 0x10;
              for (; (long)uVar49 <= (long)psVar37->spec_end; uVar49 = uVar49 + 1) {
                bVar11 = ""[uVar49];
                if (((psVar47[bVar11] != 0) && (iVar31 = stbi__jpeg_get_bit(psVar37), iVar31 != 0))
                   && (sVar63 = psVar47[bVar11], (uVar25 & (int)sVar63) == 0)) {
                  uVar72 = -uVar25;
                  if (0 < sVar63) {
                    uVar72 = uVar25;
                  }
                  psVar47[bVar11] = (short)uVar72 + sVar63;
                }
              }
            }
          }
          iVar31 = psVar37->todo;
          psVar37->todo = iVar31 + -1;
          if (iVar31 < 2) {
            if (psVar37->code_bits < 0x18) {
              stbi__grow_buffer_unsafe(psVar37);
            }
            bVar11 = psVar37->marker;
            if ((bVar11 & 0xf8) != 0xd0) goto LAB_0010cf26;
            stbi__jpeg_reset(psVar37);
          }
        }
        iVar20 = (int)local_96c8;
      }
    }
    else {
      for (iVar20 = 0; iVar20 < psVar37->img_mcu_y; iVar20 = iVar20 + 1) {
        for (iVar46 = 0; iVar46 < psVar37->img_mcu_x; iVar46 = iVar46 + 1) {
          for (lVar40 = 0; lVar40 < psVar37->scan_n; lVar40 = lVar40 + 1) {
            iVar64 = psVar37->order[lVar40];
            for (iVar31 = 0; iVar31 < paVar1[iVar64].v; iVar31 = iVar31 + 1) {
              iVar33 = 0;
              while (iVar33 < paVar1[iVar64].h) {
                iVar32 = stbi__jpeg_decode_block_prog_dc
                                   (psVar37,paVar1[iVar64].coeff +
                                            (paVar1[iVar64].h * iVar46 + iVar33 +
                                            (paVar1[iVar64].v * iVar20 + iVar31) *
                                            paVar1[iVar64].coeff_w) * 0x40,
                                    (stbi__huffman *)psVar37->huff_dc[paVar1[iVar64].hd].fast,iVar64
                                   );
                iVar33 = iVar33 + 1;
                if (iVar32 == 0) goto LAB_0010ecd4;
              }
            }
          }
          iVar64 = psVar37->todo;
          psVar37->todo = iVar64 + -1;
          if (iVar64 < 2) {
            if (psVar37->code_bits < 0x18) {
              stbi__grow_buffer_unsafe(psVar37);
            }
            bVar11 = psVar37->marker;
            if ((bVar11 & 0xf8) != 0xd0) goto LAB_0010cf26;
            stbi__jpeg_reset(psVar37);
          }
        }
      }
    }
LAB_0010cf1f:
    bVar11 = psVar37->marker;
LAB_0010cf26:
    if (bVar11 == 0xff) {
      while (iVar20 = stbi__at_eof(psVar37->s), iVar20 == 0) {
        sVar13 = stbi__get8(psVar37->s);
        while (sVar13 == 0xff) {
          iVar20 = stbi__at_eof(psVar37->s);
          if (iVar20 != 0) goto LAB_0010cf74;
          sVar13 = stbi__get8(psVar37->s);
          if ((byte)(sVar13 - 1) < 0xfe) goto LAB_0010cf79;
        }
      }
LAB_0010cf74:
      sVar13 = 0xff;
LAB_0010cf79:
      psVar37->marker = sVar13;
    }
    bVar11 = stbi__get_marker(psVar37);
    if ((bVar11 & 0xf8) == 0xd0) {
LAB_0010c4c6:
      bVar11 = stbi__get_marker(psVar37);
    }
  }
  uVar25 = (uint)bVar11;
  if (uVar25 == 0xdc) {
    iVar20 = stbi__get16be(psVar37->s);
    sVar21 = stbi__get16be(psVar37->s);
    if (iVar20 == 4) {
      if (sVar21 == psVar37->s->img_y) goto LAB_0010c4c6;
      pcVar36 = "bad DNL height";
    }
    else {
      pcVar36 = "bad DNL len";
    }
    goto LAB_0010eccb;
  }
  if (uVar25 == 0xd9) {
    if (psVar37->progressive != 0) {
      for (lVar40 = 0; lVar40 < psVar37->s->img_n; lVar40 = lVar40 + 1) {
        uVar25 = psVar37->img_comp[lVar40].x + 7 >> 3;
        iVar20 = psVar37->img_comp[lVar40].y + 7 >> 3;
        iVar46 = 0;
        if ((int)uVar25 < 1) {
          uVar25 = 0;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        for (; iVar46 != iVar20; iVar46 = iVar46 + 1) {
          for (uVar49 = 0; uVar49 != uVar25; uVar49 = uVar49 + 1) {
            psVar47 = paVar1[lVar40].coeff;
            iVar31 = paVar1[lVar40].coeff_w * iVar46;
            iVar64 = paVar1[lVar40].tq;
            iVar33 = iVar31 + (int)uVar49;
            for (lVar52 = 0; lVar52 != 0x40; lVar52 = lVar52 + 1) {
              psVar47[iVar33 * 0x40 + lVar52] =
                   psVar47[iVar33 * 0x40 + lVar52] * psVar37->dequant[iVar64][lVar52];
            }
            (*psVar37->idct_block_kernel)
                      (paVar1[lVar40].data + uVar49 * 8 + (long)(iVar46 * 8 * paVar1[lVar40].w2),
                       paVar1[lVar40].w2,psVar47 + (iVar31 + (int)uVar49) * 0x40);
          }
        }
      }
    }
  }
  else {
    iVar20 = stbi__process_marker(psVar37,uVar25);
    if (iVar20 != 0) goto LAB_0010c4c6;
  }
  psVar51 = psVar37->s;
  uVar25 = psVar51->img_n;
  if ((ulong)uVar25 == 3) {
    bVar74 = true;
    if (psVar37->rgb != 3) {
      if (psVar37->app14_color_transform != 0) goto LAB_0010e685;
      bVar74 = psVar37->jfif == 0;
    }
  }
  else {
    if ((int)uVar25 < 1) goto LAB_0010ecd4;
LAB_0010e685:
    bVar74 = false;
  }
  z_codelength.fast[8] = 0;
  z_codelength.fast[9] = 0;
  z_codelength.fast[10] = 0;
  z_codelength.fast[0xb] = 0;
  z_codelength.fast[0xc] = 0;
  z_codelength.fast[0xd] = 0;
  z_codelength.fast[0xe] = 0;
  z_codelength.fast[0xf] = 0;
  z_codelength.fast[0] = 0;
  z_codelength.fast[1] = 0;
  z_codelength.fast[2] = 0;
  z_codelength.fast[3] = 0;
  z_codelength.fast[4] = 0;
  z_codelength.fast[5] = 0;
  z_codelength.fast[6] = 0;
  z_codelength.fast[7] = 0;
  lVar40 = (ulong)uVar25 * 0x30;
  for (lVar52 = 0; lVar40 != lVar52; lVar52 = lVar52 + 0x30) {
    sVar21 = psVar51->img_x;
    pvVar42 = malloc((ulong)(sVar21 + 3));
    *(void **)((long)&psVar37->img_comp[0].linebuf + lVar52 * 2) = pvVar42;
    if (pvVar42 == (void *)0x0) {
      stbi__cleanup_jpeg(psVar37);
      goto LAB_0010eee2;
    }
    uVar49 = (long)psVar37->img_h_max / (long)*(int *)((long)&psVar37->img_comp[0].h + lVar52 * 2);
    iVar20 = (int)uVar49;
    *(int *)(&packets[8].size + lVar52) = iVar20;
    iVar46 = psVar37->img_v_max / *(int *)((long)&psVar37->img_comp[0].v + lVar52 * 2);
    *(int *)(&packets[9].type + lVar52) = iVar46;
    *(int *)((long)&local_8888 + lVar52 + 4) = iVar46 >> 1;
    *(int *)((long)&local_8888 + lVar52) =
         (int)((ulong)((sVar21 + iVar20) - 1) / (uVar49 & 0xffffffff));
    *(undefined4 *)((long)&local_8880 + lVar52) = 0;
    uVar43 = *(undefined8 *)((long)&psVar37->img_comp[0].data + lVar52 * 2);
    *(undefined8 *)(&packets[5].type + lVar52) = uVar43;
    *(undefined8 *)(&packets[2].channel + lVar52) = uVar43;
    if (iVar20 == 2) {
      pcVar41 = stbi__resample_row_h_2;
      if (iVar46 != 1) {
        if (iVar46 != 2) goto LAB_0010e796;
        pcVar41 = psVar37->resample_row_hv_2_kernel;
      }
    }
    else if (iVar20 == 1) {
      pcVar41 = stbi__resample_row_generic;
      if (iVar46 == 2) {
        pcVar41 = stbi__resample_row_v_2;
      }
      if (iVar46 == 1) {
        pcVar41 = resample_row_1;
      }
    }
    else {
LAB_0010e796:
      pcVar41 = stbi__resample_row_generic;
    }
    *(code **)(&packets[0].size + lVar52) = pcVar41;
  }
  sVar21 = psVar51->img_y;
  psVar73 = (stbi__uint16 *)stbi__malloc_mad3(4,psVar51->img_x,sVar21,1);
  if (psVar73 != (stbi__uint16 *)0x0) {
    iVar20 = 0;
    for (uVar25 = 0; uVar25 < sVar21; uVar25 = uVar25 + 1) {
      sVar21 = psVar51->img_x;
      psVar54 = &z_codelength;
      for (lVar52 = 0; lVar40 != lVar52; lVar52 = lVar52 + 0x30) {
        iVar46 = *(int *)((long)&local_8888 + lVar52 + 4);
        iVar64 = *(int *)(&packets[9].type + lVar52);
        iVar31 = iVar64 >> 1;
        psVar39 = &packets[5].type + lVar52;
        if (iVar46 < iVar31) {
          psVar39 = &packets[2].channel + lVar52;
        }
        psVar67 = &packets[5].type + lVar52;
        if (iVar31 <= iVar46) {
          psVar67 = &packets[2].channel + lVar52;
        }
        uVar43 = (**(code **)(&packets[0].size + lVar52))
                           (*(undefined8 *)((long)&psVar37->img_comp[0].linebuf + lVar52 * 2),
                            *(undefined8 *)psVar39,*(undefined8 *)psVar67,
                            *(undefined4 *)((long)&local_8888 + lVar52),
                            *(undefined4 *)(&packets[8].size + lVar52));
        *(undefined8 *)psVar54->fast = uVar43;
        *(int *)((long)&local_8888 + lVar52 + 4) = iVar46 + 1;
        if (iVar64 <= iVar46 + 1) {
          *(undefined4 *)((long)&local_8888 + lVar52 + 4) = 0;
          lVar6 = *(long *)(&packets[5].type + lVar52);
          *(long *)(&packets[2].channel + lVar52) = lVar6;
          iVar46 = *(int *)((long)&local_8880 + lVar52) + 1;
          *(int *)((long)&local_8880 + lVar52) = iVar46;
          if (iVar46 < *(int *)((long)&psVar37->img_comp[0].y + lVar52 * 2)) {
            *(long *)(&packets[5].type + lVar52) =
                 lVar6 + *(int *)((long)&psVar37->img_comp[0].w2 + lVar52 * 2);
          }
        }
        psVar54 = (stbi__zhuffman *)(psVar54->fast + 4);
      }
      psVar39 = (stbi_uc *)((ulong)(uVar25 * 4 * sVar21) + (long)psVar73);
      psVar51 = psVar37->s;
      if (psVar51->img_n == 3) {
        if (bVar74) {
          uVar72 = sVar21 * iVar20;
          for (uVar49 = 0; uVar49 < psVar51->img_x; uVar49 = uVar49 + 1) {
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72) =
                 *(uchar *)(z_codelength.fast._0_8_ + uVar49);
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 1) =
                 *(uchar *)(z_codelength.fast._8_8_ + uVar49);
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 2) =
                 *(uchar *)(z_codelength.fast._16_8_ + uVar49);
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 3) = 0xff;
          }
        }
        else {
LAB_0010eb72:
          (*psVar37->YCbCr_to_RGB_kernel)
                    (psVar39,(stbi_uc *)z_codelength.fast._0_8_,(stbi_uc *)z_codelength.fast._8_8_,
                     (stbi_uc *)z_codelength.fast._16_8_,psVar51->img_x,4);
        }
      }
      else if (psVar51->img_n == 4) {
        if (psVar37->app14_color_transform == 2) {
          (*psVar37->YCbCr_to_RGB_kernel)
                    (psVar39,(stbi_uc *)z_codelength.fast._0_8_,(stbi_uc *)z_codelength.fast._8_8_,
                     (stbi_uc *)z_codelength.fast._16_8_,psVar51->img_x,4);
          psVar51 = psVar37->s;
          uVar72 = sVar21 * iVar20;
          for (uVar49 = 0; uVar49 < psVar51->img_x; uVar49 = uVar49 + 1) {
            bVar11 = *(byte *)(z_codelength.fast._24_8_ + uVar49);
            iVar46 = (*(byte *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72) ^ 0xff) * (uint)bVar11;
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72) =
                 (uchar)((iVar46 + 0x80U >> 8) + iVar46 + 0x80 >> 8);
            iVar46 = (*(byte *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 1) ^ 0xff) *
                     (uint)bVar11;
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 1) =
                 (uchar)(iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8);
            iVar46 = (*(byte *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 2) ^ 0xff) *
                     (uint)bVar11;
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 2) =
                 (uchar)(iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8);
          }
        }
        else {
          if (psVar37->app14_color_transform != 0) goto LAB_0010eb72;
          uVar72 = sVar21 * iVar20;
          for (uVar49 = 0; uVar49 < psVar51->img_x; uVar49 = uVar49 + 1) {
            bVar11 = *(byte *)(z_codelength.fast._24_8_ + uVar49);
            iVar46 = (uint)*(byte *)(z_codelength.fast._0_8_ + uVar49) * (uint)bVar11;
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72) =
                 (uchar)((iVar46 + 0x80U >> 8) + iVar46 + 0x80 >> 8);
            iVar46 = (uint)*(byte *)(z_codelength.fast._8_8_ + uVar49) * (uint)bVar11;
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 1) =
                 (uchar)(iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8);
            iVar46 = (uint)*(byte *)(z_codelength.fast._16_8_ + uVar49) * (uint)bVar11;
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 2) =
                 (uchar)(iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8);
            *(uchar *)((long)psVar73 + uVar49 * 4 + (ulong)uVar72 + 3) = 0xff;
          }
        }
      }
      else {
        uVar62 = (ulong)(sVar21 * iVar20);
        for (uVar49 = 0; uVar49 < psVar51->img_x; uVar49 = uVar49 + 1) {
          uVar2 = *(uchar *)(z_codelength.fast._0_8_ + uVar49);
          *(uchar *)((long)psVar73 + uVar49 * 4 + uVar62 + 2) = uVar2;
          *(uchar *)((long)psVar73 + uVar49 * 4 + uVar62 + 1) = uVar2;
          *(uchar *)((long)psVar73 + uVar49 * 4 + uVar62) = uVar2;
          *(uchar *)((long)psVar73 + uVar49 * 4 + uVar62 + 3) = 0xff;
        }
      }
      psVar51 = psVar37->s;
      sVar21 = psVar51->img_y;
      iVar20 = iVar20 + 4;
    }
    stbi__cleanup_jpeg(psVar37);
    psVar51 = psVar37->s;
    *x = psVar51->img_x;
    *y = psVar51->img_y;
    if (comp != (int *)0x0) {
      *comp = (uint)(2 < psVar51->img_n) * 2 + 1;
    }
    goto LAB_0010e14a;
  }
  stbi__cleanup_jpeg(psVar37);
LAB_0010eee2:
  *(char **)(in_FS_OFFSET + -8) = "outofmem";
  goto LAB_0010ece0;
LAB_0010d46b:
  uVar25 = stbi__zreceive((stbi__zbuf *)packets,1);
  uVar26 = stbi__zreceive((stbi__zbuf *)packets,2);
  if (uVar26 != 0) {
    if (uVar26 == 1) {
      iVar20 = stbi__zbuild_huffman
                         (&local_886c,
                          "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                          ,0x120);
      if (iVar20 == 0) goto LAB_0010fa4b;
      iVar20 = stbi__zbuild_huffman
                         (local_8088,
                          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                          ,0x20);
      psVar39 = local_8888;
    }
    else {
      if (uVar26 == 3) goto LAB_0010fa4b;
      uVar27 = stbi__zreceive((stbi__zbuf *)packets,5);
      uVar28 = stbi__zreceive((stbi__zbuf *)packets,5);
      uVar29 = stbi__zreceive((stbi__zbuf *)packets,4);
      local_9688 = 0;
      uStack_9680 = 0;
      uStack_9679 = 0;
      uVar26 = uVar29 + 4;
      if ((int)(uVar29 + 4) < 1) {
        uVar26 = 0;
      }
      for (uVar49 = 0; uVar26 != uVar49; uVar49 = uVar49 + 1) {
        uVar29 = stbi__zreceive((stbi__zbuf *)packets,3);
        *(char *)((long)&local_9688 +
                 (ulong)(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar49]) = (char)uVar29
        ;
      }
      iVar20 = stbi__zbuild_huffman(&z_codelength,(stbi_uc *)&local_9688,0x13);
      if (iVar20 == 0) goto LAB_0010fa4b;
      iVar46 = uVar28 + uVar27 + 0x102;
      iVar20 = 0;
      while( true ) {
        if (iVar46 <= iVar20) break;
        uVar26 = stbi__zhuffman_decode((stbi__zbuf *)packets,&z_codelength);
        if (0x12 < uVar26) goto LAB_0010e528;
        if (uVar26 < 0x10) {
          lencodes[iVar20] = (stbi_uc)uVar26;
          iVar20 = iVar20 + 1;
        }
        else {
          if (uVar26 == 0x11) {
            uVar26 = stbi__zreceive((stbi__zbuf *)packets,3);
            iVar64 = uVar26 + 3;
LAB_0010d63c:
            uVar26 = 0;
          }
          else {
            if (uVar26 != 0x10) {
              uVar26 = stbi__zreceive((stbi__zbuf *)packets,7);
              iVar64 = uVar26 + 0xb;
              goto LAB_0010d63c;
            }
            uVar26 = stbi__zreceive((stbi__zbuf *)packets,2);
            if (iVar20 == 0) goto LAB_0010e528;
            iVar64 = uVar26 + 3;
            uVar26 = (uint)lencodes[(long)iVar20 + -1];
          }
          if (iVar46 - iVar20 < iVar64) goto LAB_0010e528;
          memset(lencodes + iVar20,uVar26,(long)iVar64);
          iVar20 = iVar20 + iVar64;
        }
      }
      if (iVar46 != iVar20) {
LAB_0010e528:
        local_9758 = "bad codelengths";
        goto LAB_0010fa42;
      }
      iVar20 = stbi__zbuild_huffman(&local_886c,lencodes,uVar27 + 0x101);
      if (iVar20 == 0) goto LAB_0010fa4b;
      iVar20 = stbi__zbuild_huffman(local_8088,lencodes + (int)(uVar27 + 0x101),uVar28 + 1);
      psVar39 = local_8888;
    }
    local_8888 = psVar39;
    if (iVar20 == 0) goto LAB_0010fa4b;
LAB_0010d809:
    while( true ) {
      uVar26 = stbi__zhuffman_decode((stbi__zbuf *)packets,&local_886c);
      if (0xff < (int)uVar26) break;
      if ((int)uVar26 < 0) {
LAB_0010e51c:
        local_9758 = "bad huffman code";
        goto LAB_0010fa42;
      }
      if ((local_8878 <= psVar39) &&
         (iVar20 = stbi__zexpand((stbi__zbuf *)packets,(char *)psVar39,1), psVar39 = local_8888,
         iVar20 == 0)) goto LAB_0010fa4b;
      *psVar39 = (stbi_uc)uVar26;
      psVar39 = psVar39 + 1;
    }
    if (uVar26 != 0x100) {
      if (0x11d < uVar26) goto LAB_0010e51c;
      uVar49 = (ulong)(uVar26 - 0x101);
      uVar26 = stbi__zlength_base[uVar49];
      if (0xffffffffffffffeb < uVar49 - 0x1c) {
        uVar27 = stbi__zreceive((stbi__zbuf *)packets,stbi__zlength_extra[uVar49]);
        uVar26 = uVar26 + uVar27;
      }
      uVar27 = stbi__zhuffman_decode((stbi__zbuf *)packets,local_8088);
      if (0x1d < uVar27) goto LAB_0010e51c;
      iVar20 = stbi__zdist_base[uVar27];
      if (3 < uVar27) {
        uVar27 = stbi__zreceive((stbi__zbuf *)packets,stbi__zdist_extra[uVar27]);
        iVar20 = iVar20 + uVar27;
      }
      if ((long)psVar39 - (long)local_8880 < (long)iVar20) {
        local_9758 = "bad dist";
        goto LAB_0010fa42;
      }
      if (((long)local_8878 - (long)psVar39 < (long)(int)uVar26) &&
         (iVar46 = stbi__zexpand((stbi__zbuf *)packets,(char *)psVar39,uVar26), psVar39 = local_8888
         , iVar46 == 0)) goto LAB_0010fa4b;
      lVar40 = -(long)iVar20;
      if (iVar20 == 1) {
        if (uVar26 != 0) {
          memset(psVar39,(uint)psVar39[lVar40],(ulong)uVar26);
          psVar39 = psVar39 + (ulong)(uVar26 - 1) + 1;
        }
      }
      else {
        for (; uVar26 != 0; uVar26 = uVar26 - 1) {
          *psVar39 = psVar39[lVar40];
          psVar39 = psVar39 + 1;
        }
      }
      goto LAB_0010d809;
    }
    local_8888 = psVar39;
    if ((packets._20_4_ != 0) && ((int)packets._16_4_ < 0x10)) {
      local_9758 = "unexpected end";
      goto LAB_0010fa42;
    }
LAB_0010d790:
    if (uVar25 != 0) goto LAB_0010f530;
    goto LAB_0010d46b;
  }
  if ((packets._16_8_ & 7) != 0) {
    stbi__zreceive((stbi__zbuf *)packets,packets._16_4_ & 7);
  }
  uVar49 = 0;
  uVar26 = packets._24_4_;
  for (iVar20 = packets._16_4_; uVar43 = packets._8_8_, 0 < iVar20; iVar20 = iVar20 + -8) {
    *(char *)((long)z_codelength.fast + uVar49) = (char)uVar26;
    uVar49 = uVar49 + 1;
    uVar26 = uVar26 >> 8;
  }
  stack0xffffffffffff7770 = (stbi_uc *)CONCAT44(stack0xffffffffffff7774,uVar26);
  packets[5].type = (char)iVar20;
  packets[5].channel = (char)((uint)iVar20 >> 8);
  packets[6].size = (char)((uint)iVar20 >> 0x10);
  packets[6].type = (char)((uint)iVar20 >> 0x18);
  puVar50 = (undefined1 *)packets._0_8_;
  if (-1 < iVar20) {
    for (; uVar49 < 4; uVar49 = uVar49 + 1) {
      if (puVar50 < (ulong)uVar43) {
        uVar45 = *puVar50;
        puVar50 = puVar50 + 1;
      }
      else {
        uVar45 = 0;
      }
      *(undefined1 *)((long)z_codelength.fast + uVar49) = uVar45;
    }
    packets._0_8_ = puVar50;
    if ((z_codelength.fast[1] ^ z_codelength.fast[0]) == 0xffff) {
      uVar49 = z_codelength.fast._0_8_ & 0xffff;
      if (puVar50 + uVar49 <= (ulong)uVar43) {
        if ((local_8888 + uVar49 <= local_8878) ||
           (iVar20 = stbi__zexpand((stbi__zbuf *)packets,(char *)local_8888,
                                   (uint)z_codelength.fast[0]), iVar20 != 0)) {
          psVar39 = local_8888;
          uVar43 = packets._0_8_;
          memcpy(local_8888,(void *)packets._0_8_,uVar49);
          packets._0_8_ = uVar43 + uVar49;
          local_8888 = psVar39 + uVar49;
          goto LAB_0010d790;
        }
        goto LAB_0010fa4b;
      }
      local_9758 = "read past buffer";
    }
  }
LAB_0010fa42:
  *(char **)(in_FS_OFFSET + -8) = local_9758;
LAB_0010fa4b:
  free(local_8880);
LAB_0010fa58:
  local_96f8.expanded = (stbi_uc *)0x0;
  psVar37 = (stbi__jpeg *)local_96f8.idata;
LAB_0010e122:
  local_96f8.idata = (stbi_uc *)psVar37;
  psVar73 = (stbi__uint16 *)0x0;
  psVar39 = local_96f8.expanded;
LAB_0010e12d:
  free(local_96f8.out);
  free(psVar39);
  psVar37 = (stbi__jpeg *)local_96f8.idata;
  goto LAB_0010e14a;
LAB_0010f530:
  local_96f8.expanded = local_8880;
  local_96c8 = local_8880;
  psVar39 = local_96c8;
  psVar37 = (stbi__jpeg *)local_96f8.idata;
  local_96c8 = local_96f8.expanded;
  if (local_8880 == (stbi_uc *)0x0) goto LAB_0010e122;
  local_96c8._0_4_ = (int)local_8880;
  sVar21 = (int)local_8888 - (int)local_96c8;
  local_96c8 = psVar39;
  free(local_96f8.idata);
  local_96f8.idata = (stbi_uc *)0x0;
  iVar20 = s->img_n + 1;
  iVar46 = s->img_n;
  if (bVar10) {
    iVar46 = iVar20;
  }
  iVar64 = iVar46;
  if (bVar18 == 0) {
    iVar64 = iVar20;
  }
  if (iVar20 != 4) {
    iVar64 = iVar46;
  }
  s->img_out_n = iVar64;
  local_96a8 = (ulong)(uint)local_96f8.depth;
  iVar20 = iVar64 << (local_96f8.depth == 0x10U);
  local_96c0 = CONCAT44(local_96c0._4_4_,iVar20);
  uVar25 = (local_96f8.s)->img_x;
  puVar61 = (undefined4 *)(ulong)uVar25;
  local_9768 = local_96f8.s;
  if (bVar11 == 0) {
    iVar20 = stbi__create_png_image_raw
                       (&local_96f8,local_96c8,sVar21,iVar64,uVar25,(local_96f8.s)->img_y,
                        local_96f8.depth,uVar72);
    psVar37 = (stbi__jpeg *)local_96f8.idata;
    if (iVar20 != 0) goto LAB_0011031c;
    goto LAB_0010e122;
  }
  local_96b0 = (stbi__uint16 *)stbi__malloc_mad3(uVar25,(local_96f8.s)->img_y,iVar20,0);
  psVar37 = (stbi__jpeg *)local_96f8.idata;
  if (local_96b0 == (stbi__uint16 *)0x0) {
LAB_0010dee3:
    local_96f8.idata = (stbi_uc *)psVar37;
    pcVar36 = "outofmem";
    goto LAB_0010e119;
  }
  sVar48 = (size_t)(int)(uint)local_96c0;
  for (uVar49 = 0; puVar61 = &DAT_0011e580, uVar49 != 7; uVar49 = uVar49 + 1) {
    uVar25 = (&DAT_0011e580)[uVar49];
    uVar26 = (&DAT_0011e5c0)[uVar49];
    uVar55 = ~uVar25 + local_9768->img_x + uVar26;
    uVar53 = uVar55 / uVar26;
    uVar27 = (&DAT_0011e5a0)[uVar49];
    uVar28 = (&DAT_0011e5e0)[uVar49];
    uVar29 = ~uVar27 + local_9768->img_y + uVar28;
    uVar65 = uVar29 / uVar28;
    if ((uVar26 <= uVar55) && (uVar28 <= uVar29)) {
      iVar46 = (int)local_96a8;
      iVar20 = local_9768->img_n;
      local_9698 = uVar49;
      iVar31 = stbi__create_png_image_raw
                         (&local_96f8,local_96c8,sVar21,iVar64,uVar53,uVar65,iVar46,uVar72);
      psVar39 = local_96f8.out;
      psVar51 = local_96f8.s;
      if (iVar31 == 0) {
        free(local_96b0);
        psVar37 = (stbi__jpeg *)local_96f8.idata;
        goto LAB_0010e122;
      }
      local_96cc = (((int)(uVar53 * iVar46 * iVar20 + 7) >> 3) + 1) * uVar65;
      local_96b8 = (anon_struct_96_18_0d0905d3 *)(long)(int)uVar65;
      local_9768 = local_96f8.s;
      iVar20 = uVar27 * (uint)local_96c0;
      iVar46 = uVar28 * (uint)local_96c0;
      local_96a0 = (stbi__uint16 *)((long)(int)uVar25 * sVar48 + (long)local_96b0);
      for (lVar40 = 0; lVar40 < (long)local_96b8; lVar40 = lVar40 + 1) {
        psVar73 = local_96a0;
        for (lVar52 = 0; lVar52 < (int)uVar53; lVar52 = lVar52 + 1) {
          memcpy((void *)((ulong)(psVar51->img_x * iVar20) + (long)psVar73),
                 (stbi__uint16 *)((lVar52 + lVar40 * (int)uVar53) * sVar48 + (long)psVar39),sVar48);
          psVar73 = (stbi__uint16 *)((long)psVar73 + (long)(int)uVar26 * sVar48);
        }
        iVar20 = iVar20 + iVar46;
      }
      free(psVar39);
      local_96c8 = local_96c8 + local_96cc;
      sVar21 = sVar21 - local_96cc;
      uVar49 = local_9698;
    }
  }
  local_96f8.out = (stbi_uc *)local_96b0;
LAB_0011031c:
  psVar39 = local_96f8.out;
  uVar25 = (uint)puVar61;
  if (bVar10) {
    iVar46 = (local_96f8.s)->img_y * (local_96f8.s)->img_x;
    iVar20 = s->img_out_n;
    if (local_96f8.depth == 0x10) {
      if (iVar20 == 4) {
        for (puVar61 = (undefined4 *)0x0; iVar46 != (int)puVar61;
            puVar61 = (undefined4 *)((long)puVar61 + 1)) {
          if (((*(stbi__uint16 *)((long)local_96f8.out + (long)puVar61 * 4 * 2) == local_968e[0]) &&
              (*(stbi__uint16 *)((long)local_96f8.out + ((long)puVar61 * 4 + 1) * 2) ==
               local_968e[1])) &&
             (*(stbi__uint16 *)((long)local_96f8.out + ((long)puVar61 * 2 + 1) * 2 * 2) ==
              local_968e[2])) {
            *(stbi__uint16 *)((long)local_96f8.out + ((long)puVar61 * 4 + 3) * 2) = 0;
          }
        }
      }
      else {
        if (iVar20 != 2) {
          __assert_fail("out_n == 2 || out_n == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                        ,0x134b,"int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                       );
        }
        for (lVar40 = 0; iVar46 != (int)lVar40; lVar40 = lVar40 + 1) {
          *(ushort *)((long)local_96f8.out + (lVar40 * 2 + 1) * 2) =
               -(ushort)(*(stbi__uint16 *)((long)local_96f8.out + lVar40 * 2 * 2) != local_968e[0]);
        }
      }
    }
    else if (iVar20 == 4) {
      for (puVar61 = (undefined4 *)0x0; iVar46 != (int)puVar61;
          puVar61 = (undefined4 *)((long)puVar61 + 1)) {
        if ((((stbi_uc)*(stbi__uint16 *)((long)local_96f8.out + (long)puVar61 * 2 * 2) == tc[0]) &&
            (*(stbi_uc *)((long)local_96f8.out + (long)puVar61 * 4 + 1) == tc[1])) &&
           ((stbi_uc)*(stbi__uint16 *)((long)local_96f8.out + ((long)puVar61 * 2 + 1) * 2) == tc[2])
           ) {
          *(undefined1 *)((long)local_96f8.out + (long)puVar61 * 4 + 3) = 0;
        }
      }
    }
    else {
      if (iVar20 != 2) {
        __assert_fail("out_n == 2 || out_n == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                      ,0x1332,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
      }
      for (lVar40 = 0; iVar46 != (int)lVar40; lVar40 = lVar40 + 1) {
        *(char *)((long)local_96f8.out + lVar40 * 2 + 1) =
             -((stbi_uc)*(stbi__uint16 *)((long)local_96f8.out + lVar40 * 2) != tc[0]);
      }
    }
    uVar25 = (uint)puVar61;
    if (bVar18 == 0) {
      s->img_n = s->img_n + 1;
    }
    else {
LAB_00110570:
      s->img_n = (uint)bVar18;
      s->img_out_n = 4;
      uVar72 = (local_96f8.s)->img_y * (local_96f8.s)->img_x;
      psVar73 = (stbi__uint16 *)stbi__malloc_mad2(uVar72,4,0);
      psVar37 = (stbi__jpeg *)local_96f8.idata;
      if (psVar73 == (stbi__uint16 *)0x0) goto LAB_0010dee3;
      for (uVar49 = 0; uVar72 != uVar49; uVar49 = uVar49 + 1) {
        *(undefined4 *)(psVar73 + uVar49 * 2) =
             *(undefined4 *)(palette + (ulong)*(byte *)((long)psVar39 + uVar49) * 4);
      }
      free(psVar39);
      local_96f8.out = (stbi_uc *)psVar73;
    }
  }
  else if (bVar18 != 0) goto LAB_00110570;
  free(local_96f8.expanded);
  stbi__get32be(s);
  psVar73 = (stbi__uint16 *)local_96f8.out;
  psVar51 = local_96f8.s;
  if (local_96f8.depth < 9) {
    iVar20 = 8;
  }
  else {
    if (local_96f8.depth != 0x10) {
      pcVar36 = "bad bits_per_channel";
      goto LAB_00110a8c;
    }
    iVar20 = 0x10;
  }
  *piVar58 = iVar20;
  local_96f8.out = (stbi_uc *)0x0;
  iVar20 = (local_96f8.s)->img_out_n;
  if (iVar20 != 4) {
    if (local_96f8.depth < 9) {
      psVar73 = (stbi__uint16 *)
                stbi__convert_format
                          ((uchar *)psVar73,iVar20,(local_96f8.s)->img_x,(local_96f8.s)->img_y,
                           uVar25);
    }
    else {
      psVar73 = stbi__convert_format16
                          (psVar73,iVar20,(local_96f8.s)->img_x,(local_96f8.s)->img_y,uVar25);
    }
    psVar51->img_out_n = 4;
    if (psVar73 == (stbi__uint16 *)0x0) {
      return (void *)0x0;
    }
  }
  *x = psVar51->img_x;
  *y = psVar51->img_y;
  if (comp != (int *)0x0) {
    *comp = psVar51->img_n;
  }
  psVar39 = (stbi_uc *)0x0;
  goto LAB_0010e12d;
LAB_00110919:
  do {
    stbi__skip(s,uVar53);
    bVar11 = stbi__get8(s);
    uVar53 = (uint)bVar11;
  } while (bVar11 != 0);
LAB_00110932:
  if (packets._8_8_ == 0) {
LAB_0010deff:
    free((void *)packets._8_8_);
    psVar73 = (stbi__uint16 *)0x0;
  }
  else {
    if (0 < local_8888._4_4_) {
      uVar62 = 0;
      uVar49 = (ulong)(uint)(packets._0_4_ * packets._4_4_);
      if ((int)(packets._0_4_ * packets._4_4_) < 1) {
        uVar49 = uVar62;
      }
      for (; uVar49 != uVar62; uVar62 = uVar62 + 1) {
        if (stack0xffffffffffff7770[uVar62] == '\0') {
          *(undefined1 *)((long)&local_8878 + (long)local_8888._4_4_ * 4 + 7) = 0xff;
          *(undefined4 *)(packets._8_8_ + uVar62 * 4) =
               *(undefined4 *)((long)&local_8878 + (long)local_8888._4_4_ * 4 + 4);
        }
      }
    }
    if ((stbi__context *)packets._8_8_ == s) goto LAB_0010deff;
    *x = packets._0_4_;
    *y = packets._4_4_;
    psVar73 = (stbi__uint16 *)packets._8_8_;
  }
  free(stack0xffffffffffff7770);
  psVar37 = (stbi__jpeg *)packets._16_8_;
  goto LAB_0010e14a;
LAB_0010df53:
  pcVar36 = "bad format";
  goto LAB_0010e0bd;
LAB_0010e66d:
  pcVar36 = "bad huffman code";
  goto LAB_0010eccb;
LAB_0010e0b6:
  pcVar36 = "bad file";
LAB_0010e0bd:
  *(char **)(in_FS_OFFSET + -8) = pcVar36;
LAB_0010e0c6:
  free(pvVar42);
  pvVar42 = (void *)0x0;
LAB_0010e0d3:
  *x = uVar25;
  *y = uVar72;
  return pvVar42;
LAB_0010ecbb:
  pcVar36 = "bad huffman code";
LAB_0010eccb:
  *(char **)(in_FS_OFFSET + -8) = pcVar36;
LAB_0010ecd4:
  stbi__cleanup_jpeg(psVar37);
LAB_0010ece0:
  psVar73 = (stbi__uint16 *)0x0;
LAB_0010e14a:
  free(psVar37);
  return psVar73;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}